

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  int iVar77;
  undefined4 uVar78;
  vint4 bi_2;
  undefined1 auVar79 [16];
  float fVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  vint4 bi;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar121;
  float fVar122;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar123;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  vint4 ai_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  vfloat4 a0_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar196;
  float fVar197;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar198;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar211;
  float fVar212;
  vfloat4 a0_1;
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar220;
  float fVar221;
  vfloat4 a0;
  float fVar222;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  ulong local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  RTCFilterFunctionNArguments local_2a8;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint auStack_158 [4];
  undefined8 local_148;
  float local_140;
  undefined8 local_13c;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint uStack_b8;
  float afStack_b4 [7];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar68 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  
  PVar4 = prim[1];
  uVar27 = (ulong)(byte)PVar4;
  fVar201 = *(float *)(prim + uVar27 * 0x19 + 0x12);
  auVar29 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar27 * 0x19 + 6));
  auVar110._0_4_ = fVar201 * auVar29._0_4_;
  auVar110._4_4_ = fVar201 * auVar29._4_4_;
  auVar110._8_4_ = fVar201 * auVar29._8_4_;
  auVar110._12_4_ = fVar201 * auVar29._12_4_;
  auVar42._0_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar42._4_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar42._8_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar42._12_4_ = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 4 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 5 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 6 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0xb + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar27 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  uVar28 = (ulong)(uint)((int)(uVar27 * 9) * 2);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 + uVar27 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  uVar21 = (ulong)(uint)((int)(uVar27 * 5) << 2);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar223._4_4_ = auVar42._0_4_;
  auVar223._0_4_ = auVar42._0_4_;
  auVar223._8_4_ = auVar42._0_4_;
  auVar223._12_4_ = auVar42._0_4_;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar32 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar201 = auVar32._0_4_;
  auVar44._0_4_ = fVar201 * auVar31._0_4_;
  fVar185 = auVar32._4_4_;
  auVar44._4_4_ = fVar185 * auVar31._4_4_;
  fVar196 = auVar32._8_4_;
  auVar44._8_4_ = fVar196 * auVar31._8_4_;
  fVar197 = auVar32._12_4_;
  auVar44._12_4_ = fVar197 * auVar31._12_4_;
  auVar85._0_4_ = auVar38._0_4_ * fVar201;
  auVar85._4_4_ = auVar38._4_4_ * fVar185;
  auVar85._8_4_ = auVar38._8_4_ * fVar196;
  auVar85._12_4_ = auVar38._12_4_ * fVar197;
  auVar43._0_4_ = auVar33._0_4_ * fVar201;
  auVar43._4_4_ = auVar33._4_4_ * fVar185;
  auVar43._8_4_ = auVar33._8_4_ * fVar196;
  auVar43._12_4_ = auVar33._12_4_ * fVar197;
  auVar32 = vfmadd231ps_fma(auVar44,auVar41,auVar30);
  auVar34 = vfmadd231ps_fma(auVar85,auVar41,auVar39);
  auVar41 = vfmadd231ps_fma(auVar43,auVar36,auVar41);
  auVar35 = vfmadd231ps_fma(auVar32,auVar223,auVar29);
  auVar34 = vfmadd231ps_fma(auVar34,auVar223,auVar40);
  auVar42 = vfmadd231ps_fma(auVar41,auVar37,auVar223);
  auVar224._4_4_ = auVar110._0_4_;
  auVar224._0_4_ = auVar110._0_4_;
  auVar224._8_4_ = auVar110._0_4_;
  auVar224._12_4_ = auVar110._0_4_;
  auVar41 = vshufps_avx(auVar110,auVar110,0x55);
  auVar32 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar201 = auVar32._0_4_;
  auVar235._0_4_ = fVar201 * auVar31._0_4_;
  fVar185 = auVar32._4_4_;
  auVar235._4_4_ = fVar185 * auVar31._4_4_;
  fVar196 = auVar32._8_4_;
  auVar235._8_4_ = fVar196 * auVar31._8_4_;
  fVar197 = auVar32._12_4_;
  auVar235._12_4_ = fVar197 * auVar31._12_4_;
  auVar124._0_4_ = auVar38._0_4_ * fVar201;
  auVar124._4_4_ = auVar38._4_4_ * fVar185;
  auVar124._8_4_ = auVar38._8_4_ * fVar196;
  auVar124._12_4_ = auVar38._12_4_ * fVar197;
  auVar111._0_4_ = auVar33._0_4_ * fVar201;
  auVar111._4_4_ = auVar33._4_4_ * fVar185;
  auVar111._8_4_ = auVar33._8_4_ * fVar196;
  auVar111._12_4_ = auVar33._12_4_ * fVar197;
  auVar30 = vfmadd231ps_fma(auVar235,auVar41,auVar30);
  auVar31 = vfmadd231ps_fma(auVar124,auVar41,auVar39);
  auVar39 = vfmadd231ps_fma(auVar111,auVar41,auVar36);
  auVar38 = vfmadd231ps_fma(auVar30,auVar224,auVar29);
  auVar36 = vfmadd231ps_fma(auVar31,auVar224,auVar40);
  auVar62._16_16_ = in_YmmResult._16_16_;
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar29);
  auVar33 = vfmadd231ps_fma(auVar39,auVar224,auVar37);
  auVar30 = vandps_avx512vl(auVar35,auVar29);
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  uVar28 = vcmpps_avx512vl(auVar30,auVar146,1);
  bVar10 = (bool)((byte)uVar28 & 1);
  auVar32._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._0_4_;
  bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar32._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._4_4_;
  bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar32._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._8_4_;
  bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar32._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._12_4_;
  auVar30 = vandps_avx512vl(auVar34,auVar29);
  uVar28 = vcmpps_avx512vl(auVar30,auVar146,1);
  bVar10 = (bool)((byte)uVar28 & 1);
  auVar35._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar34._0_4_;
  bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar34._4_4_;
  bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar34._8_4_;
  bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar34._12_4_;
  auVar29 = vandps_avx512vl(auVar42,auVar29);
  uVar28 = vcmpps_avx512vl(auVar29,auVar146,1);
  bVar10 = (bool)((byte)uVar28 & 1);
  auVar34._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._0_4_;
  bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._4_4_;
  bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._8_4_;
  bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._12_4_;
  auVar29 = vrcp14ps_avx512vl(auVar32);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT1664(auVar30);
  auVar31 = vfnmadd213ps_avx512vl(auVar32,auVar29,auVar30);
  auVar40 = vfmadd132ps_fma(auVar31,auVar29,auVar29);
  auVar29 = vrcp14ps_avx512vl(auVar35);
  auVar31 = vfnmadd213ps_avx512vl(auVar35,auVar29,auVar30);
  auVar39 = vfmadd132ps_fma(auVar31,auVar29,auVar29);
  auVar29 = vrcp14ps_avx512vl(auVar34);
  auVar30 = vfnmadd213ps_avx512vl(auVar34,auVar29,auVar30);
  auVar37 = vfmadd132ps_fma(auVar30,auVar29,auVar29);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar27 * 7 + 6);
  auVar29 = vpmovsxwd_avx(auVar29);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar38);
  auVar134._0_4_ = auVar40._0_4_ * auVar29._0_4_;
  auVar134._4_4_ = auVar40._4_4_ * auVar29._4_4_;
  auVar134._8_4_ = auVar40._8_4_ * auVar29._8_4_;
  auVar134._12_4_ = auVar40._12_4_ * auVar29._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar27 * 9 + 6);
  auVar29 = vpmovsxwd_avx(auVar30);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar38);
  auVar32 = vpbroadcastd_avx512vl();
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar30 = vpmovsxwd_avx(auVar31);
  auVar97._0_4_ = auVar40._0_4_ * auVar29._0_4_;
  auVar97._4_4_ = auVar40._4_4_ * auVar29._4_4_;
  auVar97._8_4_ = auVar40._8_4_ * auVar29._8_4_;
  auVar97._12_4_ = auVar40._12_4_ * auVar29._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar27 * -2 + 6);
  auVar29 = vpmovsxwd_avx(auVar40);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar36);
  auVar147._0_4_ = auVar39._0_4_ * auVar29._0_4_;
  auVar147._4_4_ = auVar39._4_4_ * auVar29._4_4_;
  auVar147._8_4_ = auVar39._8_4_ * auVar29._8_4_;
  auVar147._12_4_ = auVar39._12_4_ * auVar29._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar30);
  auVar29 = vsubps_avx(auVar29,auVar36);
  auVar86._0_4_ = auVar39._0_4_ * auVar29._0_4_;
  auVar86._4_4_ = auVar39._4_4_ * auVar29._4_4_;
  auVar86._8_4_ = auVar39._8_4_ * auVar29._8_4_;
  auVar86._12_4_ = auVar39._12_4_ * auVar29._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar21 + uVar27 + 6);
  auVar29 = vpmovsxwd_avx(auVar39);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar33);
  auVar125._0_4_ = auVar37._0_4_ * auVar29._0_4_;
  auVar125._4_4_ = auVar37._4_4_ * auVar29._4_4_;
  auVar125._8_4_ = auVar37._8_4_ * auVar29._8_4_;
  auVar125._12_4_ = auVar37._12_4_ * auVar29._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar27 * 0x17 + 6);
  auVar29 = vpmovsxwd_avx(auVar38);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar33);
  auVar79._0_4_ = auVar37._0_4_ * auVar29._0_4_;
  auVar79._4_4_ = auVar37._4_4_ * auVar29._4_4_;
  auVar79._8_4_ = auVar37._8_4_ * auVar29._8_4_;
  auVar79._12_4_ = auVar37._12_4_ * auVar29._12_4_;
  auVar29 = vpminsd_avx(auVar134,auVar97);
  auVar30 = vpminsd_avx(auVar147,auVar86);
  auVar29 = vmaxps_avx(auVar29,auVar30);
  auVar30 = vpminsd_avx(auVar125,auVar79);
  uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar37._4_4_ = uVar78;
  auVar37._0_4_ = uVar78;
  auVar37._8_4_ = uVar78;
  auVar37._12_4_ = uVar78;
  auVar30 = vmaxps_avx512vl(auVar30,auVar37);
  auVar29 = vmaxps_avx(auVar29,auVar30);
  auVar36._8_4_ = 0x3f7ffffa;
  auVar36._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar36._12_4_ = 0x3f7ffffa;
  local_118 = vmulps_avx512vl(auVar29,auVar36);
  auVar29 = vpmaxsd_avx(auVar134,auVar97);
  auVar30 = vpmaxsd_avx(auVar147,auVar86);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar30 = vpmaxsd_avx(auVar125,auVar79);
  fVar201 = (ray->super_RayK<1>).tfar;
  auVar33._4_4_ = fVar201;
  auVar33._0_4_ = fVar201;
  auVar33._8_4_ = fVar201;
  auVar33._12_4_ = fVar201;
  auVar30 = vminps_avx512vl(auVar30,auVar33);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar41._8_4_ = 0x3f800003;
  auVar41._0_8_ = 0x3f8000033f800003;
  auVar41._12_4_ = 0x3f800003;
  auVar29 = vmulps_avx512vl(auVar29,auVar41);
  uVar12 = vcmpps_avx512vl(local_118,auVar29,2);
  uVar28 = vpcmpgtd_avx512vl(auVar32,_DAT_01ff0cf0);
  uVar28 = ((byte)uVar12 & 0xf) & uVar28;
  if ((char)uVar28 == '\0') {
    return;
  }
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar246 = ZEXT1664(auVar29);
LAB_01b0104c:
  lVar23 = 0;
  for (uVar21 = uVar28; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar25 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar25].ptr;
  local_310 = (ulong)*(uint *)(prim + lVar23 * 4 + 6);
  uVar21 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar23 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar29 = *(undefined1 (*) [16])(_Var9 + uVar21 * (long)pvVar8);
  auVar30 = *(undefined1 (*) [16])(_Var9 + (uVar21 + 1) * (long)pvVar8);
  auVar31 = *(undefined1 (*) [16])(_Var9 + (uVar21 + 2) * (long)pvVar8);
  auVar40 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar21 + 3));
  lVar23 = *(long *)&pGVar6[1].time_range.upper;
  auVar39 = *(undefined1 (*) [16])(lVar23 + (long)p_Var7 * uVar21);
  auVar38 = *(undefined1 (*) [16])(lVar23 + (long)p_Var7 * (uVar21 + 1));
  auVar37 = *(undefined1 (*) [16])(lVar23 + (long)p_Var7 * (uVar21 + 2));
  uVar28 = uVar28 - 1 & uVar28;
  auVar36 = *(undefined1 (*) [16])(lVar23 + (long)p_Var7 * (uVar21 + 3));
  if (uVar28 != 0) {
    uVar27 = uVar28 - 1 & uVar28;
    for (uVar21 = uVar28; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    }
    if (uVar27 != 0) {
      for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar59._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar32 = vmulps_avx512vl(auVar36,auVar59._0_16_);
  auVar229._8_4_ = 0x3e2aaaab;
  auVar229._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar229._12_4_ = 0x3e2aaaab;
  auVar33 = vfmadd213ps_fma(auVar229,auVar37,auVar32);
  auVar225._8_4_ = 0x3f2aaaab;
  auVar225._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar225._12_4_ = 0x3f2aaaab;
  auVar33 = vfmadd231ps_fma(auVar33,auVar38,auVar225);
  auVar41 = vfmadd231ps_fma(auVar33,auVar39,auVar229);
  auVar42 = auVar246._0_16_;
  auVar33 = vfmadd231ps_avx512vl(auVar32,auVar37,auVar42);
  auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar38,auVar59._0_16_);
  auVar34 = vfnmadd231ps_avx512vl(auVar33,auVar39,auVar42);
  auVar32 = vmulps_avx512vl(auVar40,auVar59._0_16_);
  auVar33 = vfmadd213ps_fma(auVar229,auVar31,auVar32);
  auVar33 = vfmadd231ps_fma(auVar33,auVar30,auVar225);
  auVar33 = vfmadd231ps_fma(auVar33,auVar29,auVar229);
  auVar32 = vfmadd231ps_avx512vl(auVar32,auVar31,auVar42);
  auVar32 = vfnmadd231ps_avx512vl(auVar32,auVar30,auVar59._0_16_);
  auVar35 = vfnmadd231ps_avx512vl(auVar32,auVar29,auVar42);
  auVar98._0_4_ = auVar36._0_4_ * 0.16666667;
  auVar98._4_4_ = auVar36._4_4_ * 0.16666667;
  auVar98._8_4_ = auVar36._8_4_ * 0.16666667;
  auVar98._12_4_ = auVar36._12_4_ * 0.16666667;
  auVar32 = vfmadd231ps_fma(auVar98,auVar37,auVar225);
  auVar32 = vfmadd231ps_fma(auVar32,auVar38,auVar229);
  auVar32 = vfmadd231ps_avx512vl(auVar32,auVar39,auVar59._0_16_);
  auVar36 = vmulps_avx512vl(auVar36,auVar42);
  auVar37 = vfmadd231ps_avx512vl(auVar36,auVar59._0_16_,auVar37);
  auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar42,auVar38);
  auVar37 = vfnmadd231ps_avx512vl(auVar38,auVar59._0_16_,auVar39);
  auVar167._0_4_ = auVar40._0_4_ * 0.16666667;
  auVar167._4_4_ = auVar40._4_4_ * 0.16666667;
  auVar167._8_4_ = auVar40._8_4_ * 0.16666667;
  auVar167._12_4_ = auVar40._12_4_ * 0.16666667;
  auVar39 = vfmadd231ps_fma(auVar167,auVar31,auVar225);
  auVar39 = vfmadd231ps_fma(auVar39,auVar30,auVar229);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar29,auVar59._0_16_);
  auVar40 = vmulps_avx512vl(auVar40,auVar42);
  auVar31 = vfmadd231ps_avx512vl(auVar40,auVar59._0_16_,auVar31);
  auVar30 = vfnmadd231ps_avx512vl(auVar31,auVar42,auVar30);
  auVar38 = vfnmadd231ps_avx512vl(auVar30,auVar59._0_16_,auVar29);
  auVar29 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar30 = vshufps_avx(auVar33,auVar33,0xc9);
  fVar198 = auVar34._0_4_;
  auVar135._0_4_ = fVar198 * auVar30._0_4_;
  fVar199 = auVar34._4_4_;
  auVar135._4_4_ = fVar199 * auVar30._4_4_;
  fVar200 = auVar34._8_4_;
  auVar135._8_4_ = fVar200 * auVar30._8_4_;
  fVar84 = auVar34._12_4_;
  auVar135._12_4_ = fVar84 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar135,auVar29,auVar33);
  auVar31 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar136._0_4_ = fVar198 * auVar30._0_4_;
  auVar136._4_4_ = fVar199 * auVar30._4_4_;
  auVar136._8_4_ = fVar200 * auVar30._8_4_;
  auVar136._12_4_ = fVar84 * auVar30._12_4_;
  auVar29 = vfmsub231ps_fma(auVar136,auVar29,auVar35);
  auVar40 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar30 = vshufps_avx(auVar39,auVar39,0xc9);
  fVar109 = auVar37._0_4_;
  auVar126._0_4_ = fVar109 * auVar30._0_4_;
  fVar121 = auVar37._4_4_;
  auVar126._4_4_ = fVar121 * auVar30._4_4_;
  fVar122 = auVar37._8_4_;
  auVar126._8_4_ = fVar122 * auVar30._8_4_;
  fVar123 = auVar37._12_4_;
  auVar126._12_4_ = fVar123 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar126,auVar29,auVar39);
  auVar39 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar168._0_4_ = auVar30._0_4_ * fVar109;
  auVar168._4_4_ = auVar30._4_4_ * fVar121;
  auVar168._8_4_ = auVar30._8_4_ * fVar122;
  auVar168._12_4_ = auVar30._12_4_ * fVar123;
  auVar30 = vfmsub231ps_fma(auVar168,auVar29,auVar38);
  auVar29 = vdpps_avx(auVar31,auVar31,0x7f);
  auVar38 = vshufps_avx(auVar30,auVar30,0xc9);
  fVar185 = auVar29._0_4_;
  auVar59._16_16_ = auVar62._16_16_;
  auVar45._4_28_ = auVar59._4_28_;
  auVar45._0_4_ = fVar185;
  auVar30 = vrsqrt14ss_avx512f(auVar59._0_16_,auVar45._0_16_);
  fVar201 = auVar30._0_4_;
  auVar30 = vdpps_avx(auVar31,auVar40,0x7f);
  fVar201 = fVar201 * 1.5 + fVar185 * -0.5 * fVar201 * fVar201 * fVar201;
  fVar202 = fVar201 * auVar31._0_4_;
  fVar211 = fVar201 * auVar31._4_4_;
  fVar212 = fVar201 * auVar31._8_4_;
  fVar213 = fVar201 * auVar31._12_4_;
  auVar178._0_4_ = auVar40._0_4_ * fVar185;
  auVar178._4_4_ = auVar40._4_4_ * fVar185;
  auVar178._8_4_ = auVar40._8_4_ * fVar185;
  auVar178._12_4_ = auVar40._12_4_ * fVar185;
  fVar185 = auVar30._0_4_;
  auVar148._0_4_ = fVar185 * auVar31._0_4_;
  auVar148._4_4_ = fVar185 * auVar31._4_4_;
  auVar148._8_4_ = fVar185 * auVar31._8_4_;
  auVar148._12_4_ = fVar185 * auVar31._12_4_;
  auVar31 = vsubps_avx(auVar178,auVar148);
  auVar30 = vrcp14ss_avx512f(auVar59._0_16_,auVar45._0_16_);
  auVar29 = vfnmadd213ss_avx512f(auVar29,auVar30,ZEXT416(0x40000000));
  fVar196 = auVar30._0_4_ * auVar29._0_4_;
  auVar29 = vdpps_avx(auVar39,auVar39,0x7f);
  fVar197 = auVar29._0_4_;
  auVar60._16_16_ = auVar62._16_16_;
  auVar60._0_16_ = auVar59._0_16_;
  auVar61._4_28_ = auVar60._4_28_;
  auVar61._0_4_ = fVar197;
  auVar30 = vrsqrt14ss_avx512f(auVar59._0_16_,auVar61._0_16_);
  fVar185 = auVar30._0_4_;
  fVar185 = fVar185 * 1.5 + fVar197 * -0.5 * fVar185 * fVar185 * fVar185;
  auVar30 = vdpps_avx(auVar39,auVar38,0x7f);
  fVar214 = fVar185 * auVar39._0_4_;
  fVar220 = fVar185 * auVar39._4_4_;
  fVar221 = fVar185 * auVar39._8_4_;
  fVar222 = fVar185 * auVar39._12_4_;
  auVar137._0_4_ = fVar197 * auVar38._0_4_;
  auVar137._4_4_ = fVar197 * auVar38._4_4_;
  auVar137._8_4_ = fVar197 * auVar38._8_4_;
  auVar137._12_4_ = fVar197 * auVar38._12_4_;
  fVar197 = auVar30._0_4_;
  auVar127._0_4_ = fVar197 * auVar39._0_4_;
  auVar127._4_4_ = fVar197 * auVar39._4_4_;
  auVar127._8_4_ = fVar197 * auVar39._8_4_;
  auVar127._12_4_ = fVar197 * auVar39._12_4_;
  auVar40 = vsubps_avx(auVar137,auVar127);
  auVar30 = vrcp14ss_avx512f(auVar59._0_16_,auVar61._0_16_);
  auVar29 = vfnmadd213ss_avx512f(auVar29,auVar30,ZEXT416(0x40000000));
  fVar197 = auVar30._0_4_ * auVar29._0_4_;
  auVar29 = vshufps_avx(auVar41,auVar41,0xff);
  auVar153._0_4_ = fVar202 * auVar29._0_4_;
  auVar153._4_4_ = fVar211 * auVar29._4_4_;
  auVar153._8_4_ = fVar212 * auVar29._8_4_;
  auVar153._12_4_ = fVar213 * auVar29._12_4_;
  local_208 = vsubps_avx(auVar41,auVar153);
  auVar30 = vshufps_avx(auVar34,auVar34,0xff);
  auVar138._0_4_ = auVar30._0_4_ * fVar202 + auVar29._0_4_ * fVar201 * auVar31._0_4_ * fVar196;
  auVar138._4_4_ = auVar30._4_4_ * fVar211 + auVar29._4_4_ * fVar201 * auVar31._4_4_ * fVar196;
  auVar138._8_4_ = auVar30._8_4_ * fVar212 + auVar29._8_4_ * fVar201 * auVar31._8_4_ * fVar196;
  auVar138._12_4_ = auVar30._12_4_ * fVar213 + auVar29._12_4_ * fVar201 * auVar31._12_4_ * fVar196;
  auVar31 = vsubps_avx(auVar34,auVar138);
  local_218._0_4_ = auVar41._0_4_ + auVar153._0_4_;
  local_218._4_4_ = auVar41._4_4_ + auVar153._4_4_;
  fStack_210 = auVar41._8_4_ + auVar153._8_4_;
  fStack_20c = auVar41._12_4_ + auVar153._12_4_;
  auVar29 = vshufps_avx(auVar32,auVar32,0xff);
  auVar139._0_4_ = fVar214 * auVar29._0_4_;
  auVar139._4_4_ = fVar220 * auVar29._4_4_;
  auVar139._8_4_ = fVar221 * auVar29._8_4_;
  auVar139._12_4_ = fVar222 * auVar29._12_4_;
  local_228 = vsubps_avx(auVar32,auVar139);
  auVar30 = vshufps_avx(auVar37,auVar37,0xff);
  auVar87._0_4_ = fVar214 * auVar30._0_4_ + auVar29._0_4_ * fVar185 * auVar40._0_4_ * fVar197;
  auVar87._4_4_ = fVar220 * auVar30._4_4_ + auVar29._4_4_ * fVar185 * auVar40._4_4_ * fVar197;
  auVar87._8_4_ = fVar221 * auVar30._8_4_ + auVar29._8_4_ * fVar185 * auVar40._8_4_ * fVar197;
  auVar87._12_4_ = fVar222 * auVar30._12_4_ + auVar29._12_4_ * fVar185 * auVar40._12_4_ * fVar197;
  auVar29 = vsubps_avx(auVar37,auVar87);
  _local_238 = vaddps_avx512vl(auVar32,auVar139);
  auVar99._0_4_ = auVar31._0_4_ * 0.33333334;
  auVar99._4_4_ = auVar31._4_4_ * 0.33333334;
  auVar99._8_4_ = auVar31._8_4_ * 0.33333334;
  auVar99._12_4_ = auVar31._12_4_ * 0.33333334;
  local_248 = vaddps_avx512vl(local_208,auVar99);
  auVar100._0_4_ = auVar29._0_4_ * 0.33333334;
  auVar100._4_4_ = auVar29._4_4_ * 0.33333334;
  auVar100._8_4_ = auVar29._8_4_ * 0.33333334;
  auVar100._12_4_ = auVar29._12_4_ * 0.33333334;
  local_258 = vsubps_avx512vl(local_228,auVar100);
  auVar80._0_4_ = (fVar198 + auVar138._0_4_) * 0.33333334;
  auVar80._4_4_ = (fVar199 + auVar138._4_4_) * 0.33333334;
  auVar80._8_4_ = (fVar200 + auVar138._8_4_) * 0.33333334;
  auVar80._12_4_ = (fVar84 + auVar138._12_4_) * 0.33333334;
  _local_268 = vaddps_avx512vl(_local_218,auVar80);
  auVar81._0_4_ = (fVar109 + auVar87._0_4_) * 0.33333334;
  auVar81._4_4_ = (fVar121 + auVar87._4_4_) * 0.33333334;
  auVar81._8_4_ = (fVar122 + auVar87._8_4_) * 0.33333334;
  auVar81._12_4_ = (fVar123 + auVar87._12_4_) * 0.33333334;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  _local_278 = vsubps_avx512vl(_local_238,auVar81);
  auVar30 = vsubps_avx(local_208,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar88._4_4_ = uVar78;
  auVar88._0_4_ = uVar78;
  auVar88._8_4_ = uVar78;
  auVar88._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar201 = (pre->ray_space).vz.field_0.m128[0];
  fVar185 = (pre->ray_space).vz.field_0.m128[1];
  fVar196 = (pre->ray_space).vz.field_0.m128[2];
  fVar197 = (pre->ray_space).vz.field_0.m128[3];
  auVar82._0_4_ = fVar201 * auVar30._0_4_;
  auVar82._4_4_ = fVar185 * auVar30._4_4_;
  auVar82._8_4_ = fVar196 * auVar30._8_4_;
  auVar82._12_4_ = fVar197 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar3,auVar29);
  auVar39 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar88);
  auVar30 = vsubps_avx512vl(local_248,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar101._4_4_ = uVar78;
  auVar101._0_4_ = uVar78;
  auVar101._8_4_ = uVar78;
  auVar101._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar89._0_4_ = fVar201 * auVar30._0_4_;
  auVar89._4_4_ = fVar185 * auVar30._4_4_;
  auVar89._8_4_ = fVar196 * auVar30._8_4_;
  auVar89._12_4_ = fVar197 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar3,auVar29);
  auVar38 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar101);
  auVar30 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar154._4_4_ = uVar78;
  auVar154._0_4_ = uVar78;
  auVar154._8_4_ = uVar78;
  auVar154._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar102._0_4_ = fVar201 * auVar30._0_4_;
  auVar102._4_4_ = fVar185 * auVar30._4_4_;
  auVar102._8_4_ = fVar196 * auVar30._8_4_;
  auVar102._12_4_ = fVar197 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar3,auVar29);
  auVar37 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar154);
  auVar30 = vsubps_avx(local_228,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar169._4_4_ = uVar78;
  auVar169._0_4_ = uVar78;
  auVar169._8_4_ = uVar78;
  auVar169._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar155._0_4_ = fVar201 * auVar30._0_4_;
  auVar155._4_4_ = fVar185 * auVar30._4_4_;
  auVar155._8_4_ = fVar196 * auVar30._8_4_;
  auVar155._12_4_ = fVar197 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar3,auVar29);
  auVar36 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar169);
  auVar30 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar179._4_4_ = uVar78;
  auVar179._0_4_ = uVar78;
  auVar179._8_4_ = uVar78;
  auVar179._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar170._0_4_ = auVar30._0_4_ * fVar201;
  auVar170._4_4_ = auVar30._4_4_ * fVar185;
  auVar170._8_4_ = auVar30._8_4_ * fVar196;
  auVar170._12_4_ = auVar30._12_4_ * fVar197;
  auVar29 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar3,auVar29);
  auVar33 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar179);
  auVar30 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar186._4_4_ = uVar78;
  auVar186._0_4_ = uVar78;
  auVar186._8_4_ = uVar78;
  auVar186._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar180._0_4_ = auVar30._0_4_ * fVar201;
  auVar180._4_4_ = auVar30._4_4_ * fVar185;
  auVar180._8_4_ = auVar30._8_4_ * fVar196;
  auVar180._12_4_ = auVar30._12_4_ * fVar197;
  auVar29 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar29);
  auVar41 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar186);
  auVar30 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar203._4_4_ = uVar78;
  auVar203._0_4_ = uVar78;
  auVar203._8_4_ = uVar78;
  auVar203._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar187._0_4_ = auVar30._0_4_ * fVar201;
  auVar187._4_4_ = auVar30._4_4_ * fVar185;
  auVar187._8_4_ = auVar30._8_4_ * fVar196;
  auVar187._12_4_ = auVar30._12_4_ * fVar197;
  auVar29 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar3,auVar29);
  auVar32 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar203);
  auVar30 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
  uVar78 = auVar30._0_4_;
  auVar204._4_4_ = uVar78;
  auVar204._0_4_ = uVar78;
  auVar204._8_4_ = uVar78;
  auVar204._12_4_ = uVar78;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar128._0_4_ = fVar201 * auVar30._0_4_;
  auVar128._4_4_ = fVar185 * auVar30._4_4_;
  auVar128._8_4_ = fVar196 * auVar30._8_4_;
  auVar128._12_4_ = fVar197 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar3,auVar29);
  auVar34 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar2,auVar204);
  local_328 = vmovlhps_avx512f(auVar39,auVar33);
  auVar243 = ZEXT1664(local_328);
  local_2b8 = vmovlhps_avx(auVar38,auVar41);
  local_2c8 = vmovlhps_avx512f(auVar37,auVar32);
  _local_1e8 = vmovlhps_avx512f(auVar36,auVar34);
  auVar29 = vminps_avx512vl(local_328,local_2b8);
  auVar31 = vmaxps_avx512vl(local_328,local_2b8);
  auVar30 = vminps_avx512vl(local_2c8,_local_1e8);
  auVar30 = vminps_avx(auVar29,auVar30);
  auVar29 = vmaxps_avx512vl(local_2c8,_local_1e8);
  auVar29 = vmaxps_avx(auVar31,auVar29);
  auVar31 = vshufpd_avx(auVar30,auVar30,3);
  auVar40 = vshufpd_avx(auVar29,auVar29,3);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar29 = vmaxps_avx(auVar29,auVar40);
  auVar30 = vandps_avx512vl(auVar30,auVar241._0_16_);
  auVar29 = vandps_avx512vl(auVar29,auVar241._0_16_);
  auVar29 = vmaxps_avx(auVar30,auVar29);
  auVar30 = vmovshdup_avx(auVar29);
  auVar29 = vmaxss_avx(auVar30,auVar29);
  local_168._8_8_ = auVar39._0_8_;
  local_168._0_8_ = auVar39._0_8_;
  local_178._8_8_ = auVar38._0_8_;
  local_178._0_8_ = auVar38._0_8_;
  local_188 = vmovddup_avx512vl(auVar37);
  local_198._0_8_ = auVar36._0_8_;
  local_198._8_8_ = local_198._0_8_;
  register0x00001348 = auVar33._0_8_;
  local_1a8 = auVar33._0_8_;
  register0x00001408 = auVar41._0_8_;
  local_1b8 = auVar41._0_8_;
  register0x00001448 = auVar32._0_8_;
  local_1c8 = auVar32._0_8_;
  register0x00001488 = auVar34._0_8_;
  local_1d8 = auVar34._0_8_;
  local_1f8 = ZEXT416((uint)(auVar29._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_1f8);
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar29 = vxorps_avx512vl(local_78._0_16_,auVar14);
  local_98 = vbroadcastss_avx512vl(auVar29);
  local_2f8 = vsubps_avx512vl(local_2b8,local_328);
  local_308 = vsubps_avx512vl(local_2c8,local_2b8);
  local_c8 = vsubps_avx512vl(_local_1e8,local_2c8);
  local_d8 = vsubps_avx(_local_218,local_208);
  local_e8 = vsubps_avx512vl(_local_268,local_248);
  local_f8 = vsubps_avx512vl(_local_278,local_258);
  _local_108 = vsubps_avx512vl(_local_238,local_228);
  uVar21 = 0;
  auVar29 = ZEXT816(0x3f80000000000000);
  auVar237 = ZEXT1664(auVar29);
  do {
    local_2e8 = auVar237._0_16_;
    auVar30 = vshufps_avx(local_2e8,local_2e8,0x50);
    auVar226._8_4_ = 0x3f800000;
    auVar226._0_8_ = &DAT_3f8000003f800000;
    auVar226._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._0_16_ = auVar226;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar31 = vsubps_avx(auVar226,auVar30);
    fVar201 = auVar30._0_4_;
    auVar112._0_4_ = local_1a8._0_4_ * fVar201;
    fVar185 = auVar30._4_4_;
    auVar112._4_4_ = local_1a8._4_4_ * fVar185;
    fVar196 = auVar30._8_4_;
    auVar112._8_4_ = local_1a8._8_4_ * fVar196;
    fVar197 = auVar30._12_4_;
    auVar112._12_4_ = local_1a8._12_4_ * fVar197;
    auVar129._0_4_ = local_1b8._0_4_ * fVar201;
    auVar129._4_4_ = local_1b8._4_4_ * fVar185;
    auVar129._8_4_ = local_1b8._8_4_ * fVar196;
    auVar129._12_4_ = local_1b8._12_4_ * fVar197;
    auVar140._0_4_ = local_1c8._0_4_ * fVar201;
    auVar140._4_4_ = local_1c8._4_4_ * fVar185;
    auVar140._8_4_ = local_1c8._8_4_ * fVar196;
    auVar140._12_4_ = local_1c8._12_4_ * fVar197;
    auVar90._0_4_ = local_1d8._0_4_ * fVar201;
    auVar90._4_4_ = local_1d8._4_4_ * fVar185;
    auVar90._8_4_ = local_1d8._8_4_ * fVar196;
    auVar90._12_4_ = local_1d8._12_4_ * fVar197;
    auVar40 = vfmadd231ps_fma(auVar112,auVar31,local_168);
    auVar39 = vfmadd231ps_fma(auVar129,auVar31,local_178);
    auVar38 = vfmadd231ps_avx512vl(auVar140,auVar31,local_188);
    auVar31 = vfmadd231ps_fma(auVar90,local_198,auVar31);
    auVar30 = vmovshdup_avx(auVar29);
    fVar185 = auVar29._0_4_;
    fVar201 = (auVar30._0_4_ - fVar185) * 0.04761905;
    auVar58._4_4_ = fVar185;
    auVar58._0_4_ = fVar185;
    auVar58._8_4_ = fVar185;
    auVar58._12_4_ = fVar185;
    auVar58._16_4_ = fVar185;
    auVar58._20_4_ = fVar185;
    auVar58._24_4_ = fVar185;
    auVar58._28_4_ = fVar185;
    auVar53._0_8_ = auVar30._0_8_;
    auVar53._8_8_ = auVar53._0_8_;
    auVar53._16_8_ = auVar53._0_8_;
    auVar53._24_8_ = auVar53._0_8_;
    auVar62 = vsubps_avx(auVar53,auVar58);
    uVar78 = auVar40._0_4_;
    auVar64._4_4_ = uVar78;
    auVar64._0_4_ = uVar78;
    auVar64._8_4_ = uVar78;
    auVar64._12_4_ = uVar78;
    auVar64._16_4_ = uVar78;
    auVar64._20_4_ = uVar78;
    auVar64._24_4_ = uVar78;
    auVar64._28_4_ = uVar78;
    auVar54._8_4_ = 1;
    auVar54._0_8_ = 0x100000001;
    auVar54._12_4_ = 1;
    auVar54._16_4_ = 1;
    auVar54._20_4_ = 1;
    auVar54._24_4_ = 1;
    auVar54._28_4_ = 1;
    auVar60 = ZEXT1632(auVar40);
    auVar59 = vpermps_avx2(auVar54,auVar60);
    auVar45 = vbroadcastss_avx512vl(auVar39);
    auVar61 = ZEXT1632(auVar39);
    auVar46 = vpermps_avx512vl(auVar54,auVar61);
    auVar47 = vbroadcastss_avx512vl(auVar38);
    auVar55 = ZEXT1632(auVar38);
    auVar48 = vpermps_avx512vl(auVar54,auVar55);
    auVar49 = vbroadcastss_avx512vl(auVar31);
    auVar57 = ZEXT1632(auVar31);
    auVar50 = vpermps_avx512vl(auVar54,auVar57);
    auVar65._4_4_ = fVar201;
    auVar65._0_4_ = fVar201;
    auVar65._8_4_ = fVar201;
    auVar65._12_4_ = fVar201;
    auVar65._16_4_ = fVar201;
    auVar65._20_4_ = fVar201;
    auVar65._24_4_ = fVar201;
    auVar65._28_4_ = fVar201;
    auVar56._8_4_ = 2;
    auVar56._0_8_ = 0x200000002;
    auVar56._12_4_ = 2;
    auVar56._16_4_ = 2;
    auVar56._20_4_ = 2;
    auVar56._24_4_ = 2;
    auVar56._28_4_ = 2;
    auVar51 = vpermps_avx512vl(auVar56,auVar60);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar53 = vpermps_avx512vl(auVar52,auVar60);
    auVar60 = vpermps_avx2(auVar56,auVar61);
    auVar54 = vpermps_avx512vl(auVar52,auVar61);
    auVar61 = vpermps_avx2(auVar56,auVar55);
    auVar55 = vpermps_avx512vl(auVar52,auVar55);
    auVar56 = vpermps_avx512vl(auVar56,auVar57);
    auVar52 = vpermps_avx512vl(auVar52,auVar57);
    auVar30 = vfmadd132ps_fma(auVar62,auVar58,_DAT_02020f20);
    auVar62 = vsubps_avx(auVar118,ZEXT1632(auVar30));
    auVar57 = vmulps_avx512vl(auVar45,ZEXT1632(auVar30));
    auVar63 = ZEXT1632(auVar30);
    auVar58 = vmulps_avx512vl(auVar46,auVar63);
    auVar31 = vfmadd231ps_fma(auVar57,auVar62,auVar64);
    auVar40 = vfmadd231ps_fma(auVar58,auVar62,auVar59);
    auVar57 = vmulps_avx512vl(auVar47,auVar63);
    auVar58 = vmulps_avx512vl(auVar48,auVar63);
    auVar45 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar45);
    auVar57 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar46);
    auVar46 = vmulps_avx512vl(auVar49,auVar63);
    auVar64 = ZEXT1632(auVar30);
    auVar50 = vmulps_avx512vl(auVar50,auVar64);
    auVar58 = vfmadd231ps_avx512vl(auVar46,auVar62,auVar47);
    auVar50 = vfmadd231ps_avx512vl(auVar50,auVar62,auVar48);
    fVar196 = auVar30._0_4_;
    fVar197 = auVar30._4_4_;
    auVar46._4_4_ = fVar197 * auVar45._4_4_;
    auVar46._0_4_ = fVar196 * auVar45._0_4_;
    fVar198 = auVar30._8_4_;
    auVar46._8_4_ = fVar198 * auVar45._8_4_;
    fVar199 = auVar30._12_4_;
    auVar46._12_4_ = fVar199 * auVar45._12_4_;
    auVar46._16_4_ = auVar45._16_4_ * 0.0;
    auVar46._20_4_ = auVar45._20_4_ * 0.0;
    auVar46._24_4_ = auVar45._24_4_ * 0.0;
    auVar46._28_4_ = fVar185;
    auVar47._4_4_ = fVar197 * auVar57._4_4_;
    auVar47._0_4_ = fVar196 * auVar57._0_4_;
    auVar47._8_4_ = fVar198 * auVar57._8_4_;
    auVar47._12_4_ = fVar199 * auVar57._12_4_;
    auVar47._16_4_ = auVar57._16_4_ * 0.0;
    auVar47._20_4_ = auVar57._20_4_ * 0.0;
    auVar47._24_4_ = auVar57._24_4_ * 0.0;
    auVar47._28_4_ = auVar59._28_4_;
    auVar31 = vfmadd231ps_fma(auVar46,auVar62,ZEXT1632(auVar31));
    auVar40 = vfmadd231ps_fma(auVar47,auVar62,ZEXT1632(auVar40));
    auVar63._0_4_ = fVar196 * auVar58._0_4_;
    auVar63._4_4_ = fVar197 * auVar58._4_4_;
    auVar63._8_4_ = fVar198 * auVar58._8_4_;
    auVar63._12_4_ = fVar199 * auVar58._12_4_;
    auVar63._16_4_ = auVar58._16_4_ * 0.0;
    auVar63._20_4_ = auVar58._20_4_ * 0.0;
    auVar63._24_4_ = auVar58._24_4_ * 0.0;
    auVar63._28_4_ = 0;
    auVar48._4_4_ = fVar197 * auVar50._4_4_;
    auVar48._0_4_ = fVar196 * auVar50._0_4_;
    auVar48._8_4_ = fVar198 * auVar50._8_4_;
    auVar48._12_4_ = fVar199 * auVar50._12_4_;
    auVar48._16_4_ = auVar50._16_4_ * 0.0;
    auVar48._20_4_ = auVar50._20_4_ * 0.0;
    auVar48._24_4_ = auVar50._24_4_ * 0.0;
    auVar48._28_4_ = auVar58._28_4_;
    auVar39 = vfmadd231ps_fma(auVar63,auVar62,auVar45);
    auVar38 = vfmadd231ps_fma(auVar48,auVar62,auVar57);
    auVar50._28_4_ = auVar57._28_4_;
    auVar50._0_28_ =
         ZEXT1628(CONCAT412(fVar199 * auVar38._12_4_,
                            CONCAT48(fVar198 * auVar38._8_4_,
                                     CONCAT44(fVar197 * auVar38._4_4_,fVar196 * auVar38._0_4_))));
    auVar37 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar199 * auVar39._12_4_,
                                                 CONCAT48(fVar198 * auVar39._8_4_,
                                                          CONCAT44(fVar197 * auVar39._4_4_,
                                                                   fVar196 * auVar39._0_4_)))),
                              auVar62,ZEXT1632(auVar31));
    auVar36 = vfmadd231ps_fma(auVar50,auVar62,ZEXT1632(auVar40));
    auVar59 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar31));
    auVar45 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar40));
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar59 = vmulps_avx512vl(auVar59,auVar46);
    auVar45 = vmulps_avx512vl(auVar45,auVar46);
    auVar57._0_4_ = fVar201 * auVar59._0_4_;
    auVar57._4_4_ = fVar201 * auVar59._4_4_;
    auVar57._8_4_ = fVar201 * auVar59._8_4_;
    auVar57._12_4_ = fVar201 * auVar59._12_4_;
    auVar57._16_4_ = fVar201 * auVar59._16_4_;
    auVar57._20_4_ = fVar201 * auVar59._20_4_;
    auVar57._24_4_ = fVar201 * auVar59._24_4_;
    auVar57._28_4_ = 0;
    auVar59 = vmulps_avx512vl(auVar65,auVar45);
    auVar39 = vxorps_avx512vl(auVar49._0_16_,auVar49._0_16_);
    auVar45 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar47 = vpermt2ps_avx512vl(ZEXT1632(auVar36),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar96._0_4_ = auVar57._0_4_ + auVar37._0_4_;
    auVar96._4_4_ = auVar57._4_4_ + auVar37._4_4_;
    auVar96._8_4_ = auVar57._8_4_ + auVar37._8_4_;
    auVar96._12_4_ = auVar57._12_4_ + auVar37._12_4_;
    auVar96._16_4_ = auVar57._16_4_ + 0.0;
    auVar96._20_4_ = auVar57._20_4_ + 0.0;
    auVar96._24_4_ = auVar57._24_4_ + 0.0;
    auVar96._28_4_ = 0;
    auVar58 = ZEXT1632(auVar39);
    auVar48 = vpermt2ps_avx512vl(auVar57,_DAT_0205fd20,auVar58);
    auVar50 = vaddps_avx512vl(ZEXT1632(auVar36),auVar59);
    auVar49 = vpermt2ps_avx512vl(auVar59,_DAT_0205fd20,auVar58);
    auVar59 = vsubps_avx(auVar45,auVar48);
    auVar48 = vsubps_avx512vl(auVar47,auVar49);
    auVar49 = vmulps_avx512vl(auVar60,auVar64);
    auVar57 = vmulps_avx512vl(auVar54,auVar64);
    auVar49 = vfmadd231ps_avx512vl(auVar49,auVar62,auVar51);
    auVar51 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar53);
    auVar53 = vmulps_avx512vl(auVar61,auVar64);
    auVar57 = vmulps_avx512vl(auVar55,auVar64);
    auVar60 = vfmadd231ps_avx512vl(auVar53,auVar62,auVar60);
    auVar53 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar54);
    auVar54 = vmulps_avx512vl(auVar56,auVar64);
    auVar52 = vmulps_avx512vl(auVar52,auVar64);
    auVar31 = vfmadd231ps_fma(auVar54,auVar62,auVar61);
    auVar40 = vfmadd231ps_fma(auVar52,auVar62,auVar55);
    auVar52 = vmulps_avx512vl(auVar64,auVar60);
    auVar54 = vmulps_avx512vl(ZEXT1632(auVar30),auVar53);
    auVar52 = vfmadd231ps_avx512vl(auVar52,auVar62,auVar49);
    auVar54 = vfmadd231ps_avx512vl(auVar54,auVar62,auVar51);
    auVar60 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar199 * auVar31._12_4_,
                                            CONCAT48(fVar198 * auVar31._8_4_,
                                                     CONCAT44(fVar197 * auVar31._4_4_,
                                                              fVar196 * auVar31._0_4_)))),auVar62,
                         auVar60);
    auVar53 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar199 * auVar40._12_4_,
                                            CONCAT48(fVar198 * auVar40._8_4_,
                                                     CONCAT44(fVar197 * auVar40._4_4_,
                                                              fVar196 * auVar40._0_4_)))),auVar62,
                         auVar53);
    auVar49._4_4_ = fVar197 * auVar60._4_4_;
    auVar49._0_4_ = fVar196 * auVar60._0_4_;
    auVar49._8_4_ = fVar198 * auVar60._8_4_;
    auVar49._12_4_ = fVar199 * auVar60._12_4_;
    auVar49._16_4_ = auVar60._16_4_ * 0.0;
    auVar49._20_4_ = auVar60._20_4_ * 0.0;
    auVar49._24_4_ = auVar60._24_4_ * 0.0;
    auVar49._28_4_ = auVar55._28_4_;
    auVar51._4_4_ = fVar197 * auVar53._4_4_;
    auVar51._0_4_ = fVar196 * auVar53._0_4_;
    auVar51._8_4_ = fVar198 * auVar53._8_4_;
    auVar51._12_4_ = fVar199 * auVar53._12_4_;
    auVar51._16_4_ = auVar53._16_4_ * 0.0;
    auVar51._20_4_ = auVar53._20_4_ * 0.0;
    auVar51._24_4_ = auVar53._24_4_ * 0.0;
    auVar51._28_4_ = auVar61._28_4_;
    auVar61 = vfmadd231ps_avx512vl(auVar49,auVar62,auVar52);
    auVar49 = vfmadd231ps_avx512vl(auVar51,auVar54,auVar62);
    auVar62 = vsubps_avx512vl(auVar60,auVar52);
    auVar60 = vsubps_avx512vl(auVar53,auVar54);
    auVar62 = vmulps_avx512vl(auVar62,auVar46);
    auVar60 = vmulps_avx512vl(auVar60,auVar46);
    fVar185 = fVar201 * auVar62._0_4_;
    fVar196 = fVar201 * auVar62._4_4_;
    auVar52._4_4_ = fVar196;
    auVar52._0_4_ = fVar185;
    fVar197 = fVar201 * auVar62._8_4_;
    auVar52._8_4_ = fVar197;
    fVar198 = fVar201 * auVar62._12_4_;
    auVar52._12_4_ = fVar198;
    fVar199 = fVar201 * auVar62._16_4_;
    auVar52._16_4_ = fVar199;
    fVar200 = fVar201 * auVar62._20_4_;
    auVar52._20_4_ = fVar200;
    fVar201 = fVar201 * auVar62._24_4_;
    auVar52._24_4_ = fVar201;
    auVar52._28_4_ = auVar62._28_4_;
    auVar60 = vmulps_avx512vl(auVar65,auVar60);
    auVar46 = vpermt2ps_avx512vl(auVar61,_DAT_0205fd20,auVar58);
    auVar51 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar58);
    auVar184._0_4_ = auVar61._0_4_ + fVar185;
    auVar184._4_4_ = auVar61._4_4_ + fVar196;
    auVar184._8_4_ = auVar61._8_4_ + fVar197;
    auVar184._12_4_ = auVar61._12_4_ + fVar198;
    auVar184._16_4_ = auVar61._16_4_ + fVar199;
    auVar184._20_4_ = auVar61._20_4_ + fVar200;
    auVar184._24_4_ = auVar61._24_4_ + fVar201;
    auVar184._28_4_ = auVar61._28_4_ + auVar62._28_4_;
    auVar62 = vpermt2ps_avx512vl(auVar52,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar52 = vaddps_avx512vl(auVar49,auVar60);
    auVar60 = vpermt2ps_avx512vl(auVar60,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar62 = vsubps_avx(auVar46,auVar62);
    auVar60 = vsubps_avx512vl(auVar51,auVar60);
    auVar118 = ZEXT1632(auVar37);
    auVar53 = vsubps_avx512vl(auVar61,auVar118);
    auVar119 = ZEXT1632(auVar36);
    auVar54 = vsubps_avx512vl(auVar49,auVar119);
    auVar55 = vsubps_avx512vl(auVar46,auVar45);
    auVar53 = vaddps_avx512vl(auVar53,auVar55);
    auVar55 = vsubps_avx512vl(auVar51,auVar47);
    auVar54 = vaddps_avx512vl(auVar54,auVar55);
    auVar55 = vmulps_avx512vl(auVar119,auVar53);
    auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar118,auVar54);
    auVar56 = vmulps_avx512vl(auVar50,auVar53);
    auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar96,auVar54);
    auVar57 = vmulps_avx512vl(auVar48,auVar53);
    auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar59,auVar54);
    auVar58 = vmulps_avx512vl(auVar47,auVar53);
    auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar45,auVar54);
    auVar63 = vmulps_avx512vl(auVar49,auVar53);
    auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar61,auVar54);
    auVar64 = vmulps_avx512vl(auVar52,auVar53);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar184,auVar54);
    auVar65 = vmulps_avx512vl(auVar60,auVar53);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar62,auVar54);
    auVar53 = vmulps_avx512vl(auVar51,auVar53);
    auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar46,auVar54);
    auVar54 = vminps_avx512vl(auVar55,auVar56);
    auVar55 = vmaxps_avx512vl(auVar55,auVar56);
    auVar56 = vminps_avx512vl(auVar57,auVar58);
    auVar54 = vminps_avx512vl(auVar54,auVar56);
    auVar56 = vmaxps_avx512vl(auVar57,auVar58);
    auVar55 = vmaxps_avx512vl(auVar55,auVar56);
    auVar56 = vminps_avx512vl(auVar63,auVar64);
    auVar57 = vmaxps_avx512vl(auVar63,auVar64);
    auVar58 = vminps_avx512vl(auVar65,auVar53);
    auVar56 = vminps_avx512vl(auVar56,auVar58);
    auVar54 = vminps_avx512vl(auVar54,auVar56);
    auVar53 = vmaxps_avx512vl(auVar65,auVar53);
    auVar53 = vmaxps_avx512vl(auVar57,auVar53);
    auVar53 = vmaxps_avx512vl(auVar55,auVar53);
    uVar12 = vcmpps_avx512vl(auVar54,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar53,local_98,5);
    uVar24 = 0;
    bVar19 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar19 != 0) {
      auVar53 = vsubps_avx512vl(auVar45,auVar118);
      auVar54 = vsubps_avx512vl(auVar47,auVar119);
      auVar55 = vsubps_avx512vl(auVar46,auVar61);
      auVar53 = vaddps_avx512vl(auVar53,auVar55);
      auVar55 = vsubps_avx512vl(auVar51,auVar49);
      auVar54 = vaddps_avx512vl(auVar54,auVar55);
      auVar55 = vmulps_avx512vl(auVar119,auVar53);
      auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar54,auVar118);
      auVar50 = vmulps_avx512vl(auVar50,auVar53);
      auVar50 = vfnmadd213ps_avx512vl(auVar96,auVar54,auVar50);
      auVar48 = vmulps_avx512vl(auVar48,auVar53);
      auVar48 = vfnmadd213ps_avx512vl(auVar59,auVar54,auVar48);
      auVar59 = vmulps_avx512vl(auVar47,auVar53);
      auVar47 = vfnmadd231ps_avx512vl(auVar59,auVar54,auVar45);
      auVar59 = vmulps_avx512vl(auVar49,auVar53);
      auVar49 = vfnmadd231ps_avx512vl(auVar59,auVar54,auVar61);
      auVar59 = vmulps_avx512vl(auVar52,auVar53);
      auVar52 = vfnmadd213ps_avx512vl(auVar184,auVar54,auVar59);
      auVar59 = vmulps_avx512vl(auVar60,auVar53);
      auVar56 = vfnmadd213ps_avx512vl(auVar62,auVar54,auVar59);
      auVar62 = vmulps_avx512vl(auVar51,auVar53);
      auVar51 = vfnmadd231ps_avx512vl(auVar62,auVar46,auVar54);
      auVar59 = vminps_avx(auVar55,auVar50);
      auVar62 = vmaxps_avx(auVar55,auVar50);
      auVar45 = vminps_avx(auVar48,auVar47);
      auVar45 = vminps_avx(auVar59,auVar45);
      auVar59 = vmaxps_avx(auVar48,auVar47);
      auVar62 = vmaxps_avx(auVar62,auVar59);
      auVar61 = vminps_avx(auVar49,auVar52);
      auVar59 = vmaxps_avx(auVar49,auVar52);
      auVar46 = vminps_avx(auVar56,auVar51);
      auVar61 = vminps_avx(auVar61,auVar46);
      auVar61 = vminps_avx(auVar45,auVar61);
      auVar45 = vmaxps_avx(auVar56,auVar51);
      auVar59 = vmaxps_avx(auVar59,auVar45);
      auVar62 = vmaxps_avx(auVar62,auVar59);
      uVar12 = vcmpps_avx512vl(auVar62,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar61,local_78,2);
      uVar24 = (uint)(bVar19 & (byte)uVar12 & (byte)uVar13);
    }
    auVar239 = ZEXT3264(auVar53);
    if (uVar24 != 0) {
      auStack_158[uVar21] = uVar24;
      uVar12 = vmovlps_avx(auVar29);
      *(undefined8 *)(&uStack_b8 + uVar21 * 2) = uVar12;
      uVar27 = vmovlps_avx(local_2e8);
      auStack_58[uVar21] = uVar27;
      uVar21 = (ulong)((int)uVar21 + 1);
    }
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM18 = ZEXT3264(auVar62);
    auVar240 = ZEXT464(0x3f800000);
    auVar29 = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
    auVar238 = ZEXT1664(auVar29);
    auVar244 = ZEXT1664(local_2f8);
    auVar245 = ZEXT1664(local_308);
    do {
      auVar30 = auVar242._0_16_;
      auVar29 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar21 == 0) {
        fVar201 = (ray->super_RayK<1>).tfar;
        auVar18._4_4_ = fVar201;
        auVar18._0_4_ = fVar201;
        auVar18._8_4_ = fVar201;
        auVar18._12_4_ = fVar201;
        uVar12 = vcmpps_avx512vl(local_118,auVar18,2);
        uVar25 = (uint)uVar28 & (uint)uVar12;
        uVar28 = (ulong)uVar25;
        if (uVar25 == 0) {
          return;
        }
        goto LAB_01b0104c;
      }
      uVar20 = (int)uVar21 - 1;
      uVar22 = (ulong)uVar20;
      uVar24 = (&uStack_b8)[uVar22 * 2];
      fVar201 = afStack_b4[uVar22 * 2];
      uVar5 = auStack_158[uVar22];
      auVar236._8_8_ = 0;
      auVar236._0_8_ = auStack_58[uVar22];
      auVar237 = ZEXT1664(auVar236);
      lVar23 = 0;
      for (uVar27 = (ulong)uVar5; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar26 = uVar5 - 1 & uVar5;
      auStack_158[uVar22] = uVar26;
      if (uVar26 == 0) {
        uVar21 = (ulong)uVar20;
      }
      auVar40 = vpxord_avx512vl(auVar239._0_16_,auVar239._0_16_);
      auVar31 = vcvtsi2ss_avx512f(auVar40,lVar23);
      auVar39 = vmulss_avx512f(auVar31,SUB6416(ZEXT464(0x3e124925),0));
      lVar23 = lVar23 + 1;
      auVar31 = vpxord_avx512vl(auVar40,auVar40);
      auVar31 = vcvtsi2ss_avx512f(auVar31,lVar23);
      auVar31 = vmulss_avx512f(auVar31,SUB6416(ZEXT464(0x3e124925),0));
      auVar38 = auVar240._0_16_;
      auVar40 = vsubss_avx512f(auVar38,auVar39);
      local_2d8 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar39._0_4_)),ZEXT416(uVar24),auVar40);
      auVar40 = vsubss_avx512f(auVar38,auVar31);
      auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar31._0_4_)),ZEXT416(uVar24),auVar40);
      fVar185 = auVar31._0_4_;
      fVar196 = local_2d8._0_4_;
      fVar201 = fVar185 - fVar196;
      vucomiss_avx512f(ZEXT416((uint)fVar201));
      if (uVar5 == 0 || lVar23 == 0) break;
      auVar239 = ZEXT1664(auVar236);
      auVar40 = vshufps_avx(auVar236,auVar236,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar201));
      uVar24 = (uint)uVar21;
      auVar36 = vsubps_avx512vl(auVar30,auVar40);
      fVar197 = auVar40._0_4_;
      auVar113._0_4_ = fVar197 * (float)local_1a8._0_4_;
      fVar198 = auVar40._4_4_;
      auVar113._4_4_ = fVar198 * (float)local_1a8._4_4_;
      fVar199 = auVar40._8_4_;
      auVar113._8_4_ = fVar199 * fStack_1a0;
      fVar200 = auVar40._12_4_;
      auVar113._12_4_ = fVar200 * fStack_19c;
      auVar130._0_4_ = fVar197 * (float)local_1b8._0_4_;
      auVar130._4_4_ = fVar198 * (float)local_1b8._4_4_;
      auVar130._8_4_ = fVar199 * fStack_1b0;
      auVar130._12_4_ = fVar200 * fStack_1ac;
      auVar141._0_4_ = fVar197 * (float)local_1c8._0_4_;
      auVar141._4_4_ = fVar198 * (float)local_1c8._4_4_;
      auVar141._8_4_ = fVar199 * fStack_1c0;
      auVar141._12_4_ = fVar200 * fStack_1bc;
      auVar91._0_4_ = fVar197 * (float)local_1d8._0_4_;
      auVar91._4_4_ = fVar198 * (float)local_1d8._4_4_;
      auVar91._8_4_ = fVar199 * fStack_1d0;
      auVar91._12_4_ = fVar200 * fStack_1cc;
      auVar40 = vfmadd231ps_fma(auVar113,auVar36,local_168);
      auVar39 = vfmadd231ps_fma(auVar130,auVar36,local_178);
      auVar37 = vfmadd231ps_fma(auVar141,auVar36,local_188);
      auVar36 = vfmadd231ps_fma(auVar91,auVar36,local_198);
      auVar55._16_16_ = auVar40;
      auVar55._0_16_ = auVar40;
      auVar119._16_16_ = auVar39;
      auVar119._0_16_ = auVar39;
      auVar133._16_16_ = auVar37;
      auVar133._0_16_ = auVar37;
      auVar152._4_4_ = fVar196;
      auVar152._0_4_ = fVar196;
      auVar152._8_4_ = fVar196;
      auVar152._12_4_ = fVar196;
      auVar152._20_4_ = fVar185;
      auVar152._16_4_ = fVar185;
      auVar152._24_4_ = fVar185;
      auVar152._28_4_ = fVar185;
      auVar62 = vsubps_avx(auVar119,auVar55);
      auVar39 = vfmadd213ps_fma(auVar62,auVar152,auVar55);
      auVar62 = vsubps_avx(auVar133,auVar119);
      auVar33 = vfmadd213ps_fma(auVar62,auVar152,auVar119);
      auVar40 = vsubps_avx(auVar36,auVar37);
      auVar120._16_16_ = auVar40;
      auVar120._0_16_ = auVar40;
      auVar40 = vfmadd213ps_fma(auVar120,auVar152,auVar133);
      auVar62 = vsubps_avx(ZEXT1632(auVar33),ZEXT1632(auVar39));
      auVar39 = vfmadd213ps_fma(auVar62,auVar152,ZEXT1632(auVar39));
      auVar62 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar33));
      auVar40 = vfmadd213ps_fma(auVar62,auVar152,ZEXT1632(auVar33));
      auVar62 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar39));
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar62,auVar152);
      auVar62 = vmulps_avx512vl(auVar62,in_ZMM18._0_32_);
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar201),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar185 = auVar40._0_4_;
      auVar142._0_8_ =
           CONCAT44(auVar86._4_4_ + fVar185 * auVar62._4_4_,auVar86._0_4_ + fVar185 * auVar62._0_4_)
      ;
      auVar142._8_4_ = auVar86._8_4_ + fVar185 * auVar62._8_4_;
      auVar142._12_4_ = auVar86._12_4_ + fVar185 * auVar62._12_4_;
      auVar114._0_4_ = fVar185 * auVar62._16_4_;
      auVar114._4_4_ = fVar185 * auVar62._20_4_;
      auVar114._8_4_ = fVar185 * auVar62._24_4_;
      auVar114._12_4_ = fVar185 * auVar62._28_4_;
      auVar79 = vsubps_avx((undefined1  [16])0x0,auVar114);
      auVar32 = vshufpd_avx(auVar86,auVar86,3);
      auVar34 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar40 = vsubps_avx(auVar32,auVar86);
      auVar39 = vsubps_avx(auVar34,(undefined1  [16])0x0);
      auVar156._0_4_ = auVar39._0_4_ + auVar40._0_4_;
      auVar156._4_4_ = auVar39._4_4_ + auVar40._4_4_;
      auVar156._8_4_ = auVar39._8_4_ + auVar40._8_4_;
      auVar156._12_4_ = auVar39._12_4_ + auVar40._12_4_;
      auVar40 = vshufps_avx(auVar86,auVar86,0xb1);
      auVar39 = vshufps_avx(auVar142,auVar142,0xb1);
      auVar37 = vshufps_avx(auVar79,auVar79,0xb1);
      auVar36 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar215._4_4_ = auVar156._0_4_;
      auVar215._0_4_ = auVar156._0_4_;
      auVar215._8_4_ = auVar156._0_4_;
      auVar215._12_4_ = auVar156._0_4_;
      auVar33 = vshufps_avx(auVar156,auVar156,0x55);
      fVar185 = auVar33._0_4_;
      auVar171._0_4_ = auVar40._0_4_ * fVar185;
      fVar196 = auVar33._4_4_;
      auVar171._4_4_ = auVar40._4_4_ * fVar196;
      fVar197 = auVar33._8_4_;
      auVar171._8_4_ = auVar40._8_4_ * fVar197;
      fVar198 = auVar33._12_4_;
      auVar171._12_4_ = auVar40._12_4_ * fVar198;
      auVar181._0_4_ = auVar39._0_4_ * fVar185;
      auVar181._4_4_ = auVar39._4_4_ * fVar196;
      auVar181._8_4_ = auVar39._8_4_ * fVar197;
      auVar181._12_4_ = auVar39._12_4_ * fVar198;
      auVar188._0_4_ = auVar37._0_4_ * fVar185;
      auVar188._4_4_ = auVar37._4_4_ * fVar196;
      auVar188._8_4_ = auVar37._8_4_ * fVar197;
      auVar188._12_4_ = auVar37._12_4_ * fVar198;
      auVar157._0_4_ = auVar36._0_4_ * fVar185;
      auVar157._4_4_ = auVar36._4_4_ * fVar196;
      auVar157._8_4_ = auVar36._8_4_ * fVar197;
      auVar157._12_4_ = auVar36._12_4_ * fVar198;
      auVar40 = vfmadd231ps_fma(auVar171,auVar215,auVar86);
      auVar39 = vfmadd231ps_fma(auVar181,auVar215,auVar142);
      auVar33 = vfmadd231ps_fma(auVar188,auVar215,auVar79);
      auVar85 = vfmadd231ps_fma(auVar157,(undefined1  [16])0x0,auVar215);
      auVar41 = vshufpd_avx(auVar40,auVar40,1);
      auVar35 = vshufpd_avx(auVar39,auVar39,1);
      auVar42 = vshufpd_avx(auVar33,auVar33,1);
      auVar43 = vshufpd_avx(auVar85,auVar85,1);
      auVar37 = vminss_avx(auVar40,auVar39);
      auVar40 = vmaxss_avx(auVar39,auVar40);
      auVar36 = vminss_avx(auVar33,auVar85);
      auVar39 = vmaxss_avx(auVar85,auVar33);
      auVar36 = vminss_avx(auVar37,auVar36);
      auVar40 = vmaxss_avx(auVar39,auVar40);
      auVar33 = vminss_avx(auVar41,auVar35);
      auVar39 = vmaxss_avx(auVar35,auVar41);
      auVar41 = vminss_avx(auVar42,auVar43);
      auVar37 = vmaxss_avx(auVar43,auVar42);
      auVar33 = vminss_avx(auVar33,auVar41);
      auVar39 = vmaxss_avx(auVar37,auVar39);
      vucomiss_avx512f(auVar36);
      if ((uVar24 < 5) || (auVar39 = vucomiss_avx512f(auVar29), uVar24 < 5)) {
        auVar40 = vucomiss_avx512f(auVar29);
        uVar12 = vcmpps_avx512vl(auVar33,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar36,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar24 & ((byte)uVar13 | (byte)uVar12)) != 0) goto LAB_01b01ee1;
        uVar12 = vcmpps_avx512vl(auVar29,auVar39,5);
        uVar13 = vcmpps_avx512vl(auVar33,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar12) & 1) == 0) goto LAB_01b01ee1;
        bVar10 = true;
        auVar237 = ZEXT1664(auVar236);
      }
      else {
LAB_01b01ee1:
        uVar12 = vcmpss_avx512f(auVar36,auVar238._0_16_,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        iVar77 = auVar240._0_4_;
        fVar185 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar77);
        uVar12 = vcmpss_avx512f(auVar40,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar196 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar77);
        auVar62._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar66._4_28_ = auVar62._4_28_;
        auVar66._0_4_ = (uint)(fVar185 == fVar196) * 0x7f800000;
        auVar37 = auVar66._0_16_;
        auVar68._16_16_ = auVar62._16_16_;
        auVar68._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar67._4_28_ = auVar68._4_28_;
        auVar67._0_4_ = (uint)(fVar185 == fVar196) * -0x800000;
        auVar29 = auVar67._0_16_;
        uVar12 = vcmpss_avx512f(auVar33,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar197 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar77);
        auVar41 = ZEXT416(0xbf800000);
        if ((fVar185 != fVar197) || (NAN(fVar185) || NAN(fVar197))) {
          fVar198 = auVar33._0_4_;
          fVar185 = auVar36._0_4_;
          bVar10 = fVar198 == fVar185;
          if ((!bVar10) || (NAN(fVar198) || NAN(fVar185))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar36 = vxorps_avx512vl(auVar36,auVar17);
            auVar230._0_4_ = auVar36._0_4_ / (fVar198 - fVar185);
            auVar230._4_12_ = auVar36._4_12_;
            auVar36 = vsubss_avx512f(auVar38,auVar230);
            auVar41 = vxorps_avx512vl(auVar41,auVar41);
            auVar33 = vfmadd213ss_avx512f(auVar36,auVar41,auVar230);
            auVar36 = auVar33;
          }
          else {
            auVar41 = vxorps_avx512vl(auVar41,auVar41);
            vucomiss_avx512f(auVar41);
            auVar70._16_16_ = auVar62._16_16_;
            auVar70._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar69._4_28_ = auVar70._4_28_;
            auVar69._0_4_ = (uint)bVar10 * auVar41._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar33 = auVar69._0_16_;
            auVar36 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar37 = vminss_avx(auVar37,auVar33);
          auVar29 = vmaxss_avx(auVar36,auVar29);
        }
        else {
          auVar41 = vxorps_avx512vl(auVar41,auVar41);
        }
        auVar238 = ZEXT1664(auVar41);
        auVar237 = ZEXT1664(auVar236);
        uVar12 = vcmpss_avx512f(auVar39,auVar41,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar185 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar77);
        if ((fVar196 != fVar185) || (NAN(fVar196) || NAN(fVar185))) {
          fVar198 = auVar39._0_4_;
          fVar196 = auVar40._0_4_;
          bVar10 = fVar198 == fVar196;
          if ((!bVar10) || (NAN(fVar198) || NAN(fVar196))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar40 = vxorps_avx512vl(auVar40,auVar16);
            auVar189._0_4_ = auVar40._0_4_ / (fVar198 - fVar196);
            auVar189._4_12_ = auVar40._4_12_;
            auVar40 = vsubss_avx512f(auVar38,auVar189);
            auVar39 = vfmadd213ss_avx512f(auVar40,auVar41,auVar189);
            auVar40 = auVar39;
          }
          else {
            vucomiss_avx512f(auVar41);
            auVar72._16_16_ = auVar62._16_16_;
            auVar72._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar71._4_28_ = auVar72._4_28_;
            auVar71._0_4_ = (uint)bVar10 * auVar41._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar39 = auVar71._0_16_;
            auVar40 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar37 = vminss_avx(auVar37,auVar39);
          auVar29 = vmaxss_avx(auVar40,auVar29);
        }
        bVar10 = fVar197 != fVar185;
        auVar40 = vminss_avx512f(auVar37,auVar38);
        auVar74._16_16_ = auVar62._16_16_;
        auVar74._0_16_ = auVar37;
        auVar73._4_28_ = auVar74._4_28_;
        auVar73._0_4_ = (uint)bVar10 * auVar40._0_4_ + (uint)!bVar10 * auVar37._0_4_;
        auVar40 = vmaxss_avx512f(auVar38,auVar29);
        auVar76._16_16_ = auVar62._16_16_;
        auVar76._0_16_ = auVar29;
        auVar75._4_28_ = auVar76._4_28_;
        auVar75._0_4_ = (uint)bVar10 * auVar40._0_4_ + (uint)!bVar10 * auVar29._0_4_;
        auVar29 = vmaxss_avx512f(auVar41,auVar73._0_16_);
        auVar40 = vminss_avx512f(auVar75._0_16_,auVar38);
        bVar10 = true;
        if (auVar29._0_4_ <= auVar40._0_4_) {
          auVar37 = vmaxss_avx512f(auVar41,ZEXT416((uint)(auVar29._0_4_ + -0.1)));
          auVar35 = vminss_avx512f(ZEXT416((uint)(auVar40._0_4_ + 0.1)),auVar38);
          auVar92._0_8_ = auVar86._0_8_;
          auVar92._8_8_ = auVar92._0_8_;
          auVar182._8_8_ = auVar142._0_8_;
          auVar182._0_8_ = auVar142._0_8_;
          auVar190._8_8_ = auVar79._0_8_;
          auVar190._0_8_ = auVar79._0_8_;
          auVar29 = vshufpd_avx(auVar142,auVar142,3);
          auVar40 = vshufpd_avx(auVar79,auVar79,3);
          auVar39 = vshufps_avx(auVar37,auVar35,0);
          auVar42 = vsubps_avx512vl(auVar30,auVar39);
          fVar185 = auVar39._0_4_;
          auVar227._0_4_ = fVar185 * auVar32._0_4_;
          fVar196 = auVar39._4_4_;
          auVar227._4_4_ = fVar196 * auVar32._4_4_;
          fVar197 = auVar39._8_4_;
          auVar227._8_4_ = fVar197 * auVar32._8_4_;
          fVar198 = auVar39._12_4_;
          auVar227._12_4_ = fVar198 * auVar32._12_4_;
          auVar143._0_4_ = fVar185 * auVar29._0_4_;
          auVar143._4_4_ = fVar196 * auVar29._4_4_;
          auVar143._8_4_ = fVar197 * auVar29._8_4_;
          auVar143._12_4_ = fVar198 * auVar29._12_4_;
          auVar149._0_4_ = fVar185 * auVar40._0_4_;
          auVar149._4_4_ = fVar196 * auVar40._4_4_;
          auVar149._8_4_ = fVar197 * auVar40._8_4_;
          auVar149._12_4_ = fVar198 * auVar40._12_4_;
          auVar115._0_4_ = fVar185 * auVar34._0_4_;
          auVar115._4_4_ = fVar196 * auVar34._4_4_;
          auVar115._8_4_ = fVar197 * auVar34._8_4_;
          auVar115._12_4_ = fVar198 * auVar34._12_4_;
          auVar36 = vfmadd231ps_fma(auVar227,auVar42,auVar92);
          auVar33 = vfmadd231ps_fma(auVar143,auVar42,auVar182);
          auVar41 = vfmadd231ps_fma(auVar149,auVar42,auVar190);
          auVar32 = vfmadd231ps_fma(auVar115,auVar42,ZEXT816(0));
          auVar40 = vsubss_avx512f(auVar38,auVar37);
          auVar29 = vmovshdup_avx(auVar236);
          auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ * auVar37._0_4_)),auVar236,auVar40)
          ;
          auVar40 = vsubss_avx512f(auVar38,auVar35);
          auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * auVar29._0_4_)),auVar236,auVar40)
          ;
          auVar34 = vdivss_avx512f(auVar38,ZEXT416((uint)fVar201));
          auVar29 = vsubps_avx(auVar33,auVar36);
          auVar103._0_4_ = auVar29._0_4_ * 3.0;
          auVar103._4_4_ = auVar29._4_4_ * 3.0;
          auVar103._8_4_ = auVar29._8_4_ * 3.0;
          auVar103._12_4_ = auVar29._12_4_ * 3.0;
          auVar29 = vsubps_avx(auVar41,auVar33);
          auVar158._0_4_ = auVar29._0_4_ * 3.0;
          auVar158._4_4_ = auVar29._4_4_ * 3.0;
          auVar158._8_4_ = auVar29._8_4_ * 3.0;
          auVar158._12_4_ = auVar29._12_4_ * 3.0;
          auVar29 = vsubps_avx(auVar32,auVar41);
          auVar172._0_4_ = auVar29._0_4_ * 3.0;
          auVar172._4_4_ = auVar29._4_4_ * 3.0;
          auVar172._8_4_ = auVar29._8_4_ * 3.0;
          auVar172._12_4_ = auVar29._12_4_ * 3.0;
          auVar40 = vminps_avx(auVar158,auVar172);
          auVar29 = vmaxps_avx(auVar158,auVar172);
          auVar40 = vminps_avx(auVar103,auVar40);
          auVar29 = vmaxps_avx(auVar103,auVar29);
          auVar39 = vshufpd_avx(auVar40,auVar40,3);
          auVar37 = vshufpd_avx(auVar29,auVar29,3);
          auVar40 = vminps_avx(auVar40,auVar39);
          auVar29 = vmaxps_avx(auVar29,auVar37);
          fVar201 = auVar34._0_4_;
          auVar173._0_4_ = fVar201 * auVar40._0_4_;
          auVar173._4_4_ = fVar201 * auVar40._4_4_;
          auVar173._8_4_ = fVar201 * auVar40._8_4_;
          auVar173._12_4_ = fVar201 * auVar40._12_4_;
          auVar159._0_4_ = fVar201 * auVar29._0_4_;
          auVar159._4_4_ = fVar201 * auVar29._4_4_;
          auVar159._8_4_ = fVar201 * auVar29._8_4_;
          auVar159._12_4_ = fVar201 * auVar29._12_4_;
          auVar34 = vdivss_avx512f(auVar38,ZEXT416((uint)(auVar86._0_4_ - auVar85._0_4_)));
          auVar29 = vshufpd_avx(auVar36,auVar36,3);
          auVar40 = vshufpd_avx(auVar33,auVar33,3);
          auVar39 = vshufpd_avx(auVar41,auVar41,3);
          auVar37 = vshufpd_avx(auVar32,auVar32,3);
          auVar29 = vsubps_avx(auVar29,auVar36);
          auVar36 = vsubps_avx(auVar40,auVar33);
          auVar33 = vsubps_avx(auVar39,auVar41);
          auVar37 = vsubps_avx(auVar37,auVar32);
          auVar40 = vminps_avx(auVar29,auVar36);
          auVar29 = vmaxps_avx(auVar29,auVar36);
          auVar39 = vminps_avx(auVar33,auVar37);
          auVar39 = vminps_avx(auVar40,auVar39);
          auVar40 = vmaxps_avx(auVar33,auVar37);
          auVar29 = vmaxps_avx(auVar29,auVar40);
          fVar201 = auVar34._0_4_;
          auVar191._0_4_ = fVar201 * auVar39._0_4_;
          auVar191._4_4_ = fVar201 * auVar39._4_4_;
          auVar191._8_4_ = fVar201 * auVar39._8_4_;
          auVar191._12_4_ = fVar201 * auVar39._12_4_;
          auVar205._0_4_ = fVar201 * auVar29._0_4_;
          auVar205._4_4_ = fVar201 * auVar29._4_4_;
          auVar205._8_4_ = fVar201 * auVar29._8_4_;
          auVar205._12_4_ = fVar201 * auVar29._12_4_;
          auVar36 = vinsertps_avx(local_2d8,auVar85,0x10);
          auVar33 = vinsertps_avx(auVar31,auVar86,0x10);
          auVar83._0_4_ = auVar36._0_4_ + auVar33._0_4_;
          auVar83._4_4_ = auVar36._4_4_ + auVar33._4_4_;
          auVar83._8_4_ = auVar36._8_4_ + auVar33._8_4_;
          auVar83._12_4_ = auVar36._12_4_ + auVar33._12_4_;
          auVar43 = vmulps_avx512vl(auVar83,auVar246._0_16_);
          auVar39 = vshufps_avx(auVar43,auVar43,0x54);
          uVar78 = auVar43._0_4_;
          auVar104._4_4_ = uVar78;
          auVar104._0_4_ = uVar78;
          auVar104._8_4_ = uVar78;
          auVar104._12_4_ = uVar78;
          auVar41 = vfmadd213ps_avx512vl(auVar244._0_16_,auVar104,auVar243._0_16_);
          auVar40 = vfmadd213ps_fma(auVar245._0_16_,auVar104,local_2b8);
          auVar37 = vfmadd213ps_fma(local_c8,auVar104,local_2c8);
          auVar239 = ZEXT1664(local_2d8);
          auVar29 = vsubps_avx(auVar40,auVar41);
          auVar41 = vfmadd213ps_fma(auVar29,auVar104,auVar41);
          auVar29 = vsubps_avx(auVar37,auVar40);
          auVar29 = vfmadd213ps_fma(auVar29,auVar104,auVar40);
          auVar29 = vsubps_avx(auVar29,auVar41);
          auVar40 = vfmadd231ps_fma(auVar41,auVar29,auVar104);
          auVar105._0_8_ = CONCAT44(auVar29._4_4_ * 3.0,auVar29._0_4_ * 3.0);
          auVar105._8_4_ = auVar29._8_4_ * 3.0;
          auVar105._12_4_ = auVar29._12_4_ * 3.0;
          auVar216._8_8_ = auVar40._0_8_;
          auVar216._0_8_ = auVar40._0_8_;
          auVar29 = vshufpd_avx(auVar40,auVar40,3);
          auVar40 = vshufps_avx(auVar43,auVar43,0x55);
          auVar37 = vsubps_avx(auVar29,auVar216);
          auVar41 = vfmadd231ps_fma(auVar216,auVar40,auVar37);
          auVar231._8_8_ = auVar105._0_8_;
          auVar231._0_8_ = auVar105._0_8_;
          auVar29 = vshufpd_avx(auVar105,auVar105,3);
          auVar29 = vsubps_avx(auVar29,auVar231);
          auVar40 = vfmadd213ps_fma(auVar29,auVar40,auVar231);
          auVar106._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
          auVar106._8_4_ = auVar37._8_4_ ^ 0x80000000;
          auVar106._12_4_ = auVar37._12_4_ ^ 0x80000000;
          auVar29 = vmovshdup_avx(auVar40);
          auVar232._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
          auVar232._8_4_ = auVar29._8_4_ ^ 0x80000000;
          auVar232._12_4_ = auVar29._12_4_ ^ 0x80000000;
          auVar32 = vmovshdup_avx512vl(auVar37);
          auVar34 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar37);
          auVar29 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar29._0_4_ * auVar37._0_4_)),auVar40,
                                        auVar32);
          auVar40 = vpermt2ps_avx512vl(auVar40,SUB6416(ZEXT464(4),0),auVar106);
          auVar116._0_4_ = auVar29._0_4_;
          auVar116._4_4_ = auVar116._0_4_;
          auVar116._8_4_ = auVar116._0_4_;
          auVar116._12_4_ = auVar116._0_4_;
          auVar29 = vdivps_avx(auVar34,auVar116);
          auVar40 = vdivps_avx(auVar40,auVar116);
          fVar185 = auVar41._0_4_;
          auVar37 = vshufps_avx(auVar41,auVar41,0x55);
          fVar201 = auVar40._0_4_;
          auVar217._0_4_ = fVar185 * auVar29._0_4_ + auVar37._0_4_ * fVar201;
          auVar217._4_4_ = fVar185 * auVar29._4_4_ + auVar37._4_4_ * auVar40._4_4_;
          auVar217._8_4_ = fVar185 * auVar29._8_4_ + auVar37._8_4_ * auVar40._8_4_;
          auVar217._12_4_ = fVar185 * auVar29._12_4_ + auVar37._12_4_ * auVar40._12_4_;
          auVar79 = vsubps_avx(auVar39,auVar217);
          auVar41 = vmovshdup_avx(auVar29);
          auVar39 = vinsertps_avx(auVar173,auVar191,0x1c);
          auVar233._0_4_ = auVar41._0_4_ * auVar39._0_4_;
          auVar233._4_4_ = auVar41._4_4_ * auVar39._4_4_;
          auVar233._8_4_ = auVar41._8_4_ * auVar39._8_4_;
          auVar233._12_4_ = auVar41._12_4_ * auVar39._12_4_;
          auVar37 = vinsertps_avx(auVar159,auVar205,0x1c);
          auVar218._0_4_ = auVar41._0_4_ * auVar37._0_4_;
          auVar218._4_4_ = auVar41._4_4_ * auVar37._4_4_;
          auVar218._8_4_ = auVar41._8_4_ * auVar37._8_4_;
          auVar218._12_4_ = auVar41._12_4_ * auVar37._12_4_;
          auVar42 = vminps_avx512vl(auVar233,auVar218);
          auVar34 = vmaxps_avx(auVar218,auVar233);
          auVar35 = vmovshdup_avx(auVar40);
          auVar41 = vinsertps_avx(auVar191,auVar173,0x4c);
          auVar192._0_4_ = auVar35._0_4_ * auVar41._0_4_;
          auVar192._4_4_ = auVar35._4_4_ * auVar41._4_4_;
          auVar192._8_4_ = auVar35._8_4_ * auVar41._8_4_;
          auVar192._12_4_ = auVar35._12_4_ * auVar41._12_4_;
          auVar32 = vinsertps_avx(auVar205,auVar159,0x4c);
          auVar206._0_4_ = auVar35._0_4_ * auVar32._0_4_;
          auVar206._4_4_ = auVar35._4_4_ * auVar32._4_4_;
          auVar206._8_4_ = auVar35._8_4_ * auVar32._8_4_;
          auVar206._12_4_ = auVar35._12_4_ * auVar32._12_4_;
          auVar35 = vminps_avx(auVar192,auVar206);
          auVar42 = vaddps_avx512vl(auVar42,auVar35);
          auVar35 = vmaxps_avx(auVar206,auVar192);
          auVar193._0_4_ = auVar34._0_4_ + auVar35._0_4_;
          auVar193._4_4_ = auVar34._4_4_ + auVar35._4_4_;
          auVar193._8_4_ = auVar34._8_4_ + auVar35._8_4_;
          auVar193._12_4_ = auVar34._12_4_ + auVar35._12_4_;
          auVar207._8_8_ = 0x3f80000000000000;
          auVar207._0_8_ = 0x3f80000000000000;
          auVar34 = vsubps_avx(auVar207,auVar193);
          auVar35 = vsubps_avx(auVar207,auVar42);
          auVar42 = vsubps_avx(auVar36,auVar43);
          auVar43 = vsubps_avx(auVar33,auVar43);
          fVar199 = auVar42._0_4_;
          auVar234._0_4_ = fVar199 * auVar34._0_4_;
          fVar200 = auVar42._4_4_;
          auVar234._4_4_ = fVar200 * auVar34._4_4_;
          fVar84 = auVar42._8_4_;
          auVar234._8_4_ = fVar84 * auVar34._8_4_;
          fVar109 = auVar42._12_4_;
          auVar234._12_4_ = fVar109 * auVar34._12_4_;
          auVar44 = vbroadcastss_avx512vl(auVar29);
          auVar39 = vmulps_avx512vl(auVar44,auVar39);
          auVar37 = vmulps_avx512vl(auVar44,auVar37);
          auVar44 = vminps_avx512vl(auVar39,auVar37);
          auVar39 = vmaxps_avx(auVar37,auVar39);
          auVar174._0_4_ = fVar201 * auVar41._0_4_;
          auVar174._4_4_ = fVar201 * auVar41._4_4_;
          auVar174._8_4_ = fVar201 * auVar41._8_4_;
          auVar174._12_4_ = fVar201 * auVar41._12_4_;
          auVar160._0_4_ = fVar201 * auVar32._0_4_;
          auVar160._4_4_ = fVar201 * auVar32._4_4_;
          auVar160._8_4_ = fVar201 * auVar32._8_4_;
          auVar160._12_4_ = fVar201 * auVar32._12_4_;
          auVar37 = vminps_avx(auVar174,auVar160);
          auVar41 = vaddps_avx512vl(auVar44,auVar37);
          auVar32 = vmulps_avx512vl(auVar42,auVar35);
          fVar185 = auVar43._0_4_;
          auVar194._0_4_ = fVar185 * auVar34._0_4_;
          fVar196 = auVar43._4_4_;
          auVar194._4_4_ = fVar196 * auVar34._4_4_;
          fVar197 = auVar43._8_4_;
          auVar194._8_4_ = fVar197 * auVar34._8_4_;
          fVar198 = auVar43._12_4_;
          auVar194._12_4_ = fVar198 * auVar34._12_4_;
          auVar208._0_4_ = fVar185 * auVar35._0_4_;
          auVar208._4_4_ = fVar196 * auVar35._4_4_;
          auVar208._8_4_ = fVar197 * auVar35._8_4_;
          auVar208._12_4_ = fVar198 * auVar35._12_4_;
          auVar37 = vmaxps_avx(auVar160,auVar174);
          auVar161._0_4_ = auVar39._0_4_ + auVar37._0_4_;
          auVar161._4_4_ = auVar39._4_4_ + auVar37._4_4_;
          auVar161._8_4_ = auVar39._8_4_ + auVar37._8_4_;
          auVar161._12_4_ = auVar39._12_4_ + auVar37._12_4_;
          auVar175._8_8_ = 0x3f800000;
          auVar175._0_8_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar175,auVar161);
          auVar37 = vsubps_avx(auVar175,auVar41);
          auVar228._0_4_ = fVar199 * auVar39._0_4_;
          auVar228._4_4_ = fVar200 * auVar39._4_4_;
          auVar228._8_4_ = fVar84 * auVar39._8_4_;
          auVar228._12_4_ = fVar109 * auVar39._12_4_;
          auVar219._0_4_ = fVar199 * auVar37._0_4_;
          auVar219._4_4_ = fVar200 * auVar37._4_4_;
          auVar219._8_4_ = fVar84 * auVar37._8_4_;
          auVar219._12_4_ = fVar109 * auVar37._12_4_;
          auVar162._0_4_ = fVar185 * auVar39._0_4_;
          auVar162._4_4_ = fVar196 * auVar39._4_4_;
          auVar162._8_4_ = fVar197 * auVar39._8_4_;
          auVar162._12_4_ = fVar198 * auVar39._12_4_;
          auVar176._0_4_ = fVar185 * auVar37._0_4_;
          auVar176._4_4_ = fVar196 * auVar37._4_4_;
          auVar176._8_4_ = fVar197 * auVar37._8_4_;
          auVar176._12_4_ = fVar198 * auVar37._12_4_;
          auVar39 = vminps_avx(auVar228,auVar219);
          auVar37 = vminps_avx(auVar162,auVar176);
          auVar41 = vminps_avx(auVar39,auVar37);
          auVar39 = vmaxps_avx(auVar219,auVar228);
          auVar37 = vmaxps_avx(auVar176,auVar162);
          auVar37 = vmaxps_avx(auVar37,auVar39);
          auVar34 = vminps_avx512vl(auVar234,auVar32);
          auVar39 = vminps_avx(auVar194,auVar208);
          auVar39 = vminps_avx(auVar34,auVar39);
          auVar39 = vhaddps_avx(auVar41,auVar39);
          auVar34 = vmaxps_avx512vl(auVar32,auVar234);
          auVar41 = vmaxps_avx(auVar208,auVar194);
          auVar41 = vmaxps_avx(auVar41,auVar34);
          auVar37 = vhaddps_avx(auVar37,auVar41);
          auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
          auVar37 = vshufps_avx(auVar37,auVar37,0xe8);
          auVar163._0_4_ = auVar39._0_4_ + auVar79._0_4_;
          auVar163._4_4_ = auVar39._4_4_ + auVar79._4_4_;
          auVar163._8_4_ = auVar39._8_4_ + auVar79._8_4_;
          auVar163._12_4_ = auVar39._12_4_ + auVar79._12_4_;
          auVar177._0_4_ = auVar37._0_4_ + auVar79._0_4_;
          auVar177._4_4_ = auVar37._4_4_ + auVar79._4_4_;
          auVar177._8_4_ = auVar37._8_4_ + auVar79._8_4_;
          auVar177._12_4_ = auVar37._12_4_ + auVar79._12_4_;
          auVar39 = vmaxps_avx(auVar36,auVar163);
          auVar37 = vminps_avx(auVar177,auVar33);
          uVar27 = vcmpps_avx512vl(auVar37,auVar39,1);
          local_2e8 = vinsertps_avx(auVar85,auVar86,0x10);
          auVar237 = ZEXT1664(local_2e8);
          if ((uVar27 & 3) == 0) {
            vucomiss_avx512f(local_2d8);
            auVar39 = vxorps_avx512vl(auVar32,auVar32);
            auVar238 = ZEXT1664(auVar39);
            auVar243 = ZEXT1664(local_328);
            if (uVar24 < 4 && (uVar5 == 0 || lVar23 == 0)) {
              bVar10 = false;
            }
            else {
              lVar23 = 200;
              do {
                auVar37 = vsubss_avx512f(auVar38,auVar79);
                fVar197 = auVar37._0_4_;
                fVar185 = fVar197 * fVar197 * fVar197;
                fVar198 = auVar79._0_4_;
                fVar196 = fVar198 * 3.0 * fVar197 * fVar197;
                fVar197 = fVar197 * fVar198 * fVar198 * 3.0;
                auVar144._4_4_ = fVar185;
                auVar144._0_4_ = fVar185;
                auVar144._8_4_ = fVar185;
                auVar144._12_4_ = fVar185;
                auVar131._4_4_ = fVar196;
                auVar131._0_4_ = fVar196;
                auVar131._8_4_ = fVar196;
                auVar131._12_4_ = fVar196;
                auVar93._4_4_ = fVar197;
                auVar93._0_4_ = fVar197;
                auVar93._8_4_ = fVar197;
                auVar93._12_4_ = fVar197;
                fVar198 = fVar198 * fVar198 * fVar198;
                auVar150._0_4_ = (float)local_1e8._0_4_ * fVar198;
                auVar150._4_4_ = (float)local_1e8._4_4_ * fVar198;
                auVar150._8_4_ = fStack_1e0 * fVar198;
                auVar150._12_4_ = fStack_1dc * fVar198;
                auVar37 = vfmadd231ps_fma(auVar150,local_2c8,auVar93);
                auVar37 = vfmadd231ps_fma(auVar37,local_2b8,auVar131);
                auVar37 = vfmadd231ps_avx512vl(auVar37,local_328,auVar144);
                auVar94._8_8_ = auVar37._0_8_;
                auVar94._0_8_ = auVar37._0_8_;
                auVar37 = vshufpd_avx(auVar37,auVar37,3);
                auVar36 = vshufps_avx(auVar79,auVar79,0x55);
                auVar37 = vsubps_avx(auVar37,auVar94);
                auVar36 = vfmadd213ps_fma(auVar37,auVar36,auVar94);
                fVar185 = auVar36._0_4_;
                auVar37 = vshufps_avx(auVar36,auVar36,0x55);
                auVar95._0_4_ = auVar29._0_4_ * fVar185 + fVar201 * auVar37._0_4_;
                auVar95._4_4_ = auVar29._4_4_ * fVar185 + auVar40._4_4_ * auVar37._4_4_;
                auVar95._8_4_ = auVar29._8_4_ * fVar185 + auVar40._8_4_ * auVar37._8_4_;
                auVar95._12_4_ = auVar29._12_4_ * fVar185 + auVar40._12_4_ * auVar37._12_4_;
                auVar79 = vsubps_avx(auVar79,auVar95);
                auVar37 = vandps_avx512vl(auVar36,auVar241._0_16_);
                auVar36 = vprolq_avx512vl(auVar37,0x20);
                auVar37 = vmaxss_avx(auVar36,auVar37);
                bVar11 = auVar37._0_4_ <= (float)local_1f8._0_4_;
                if (auVar37._0_4_ < (float)local_1f8._0_4_) {
                  auVar29 = vucomiss_avx512f(auVar39);
                  if (bVar11) {
                    auVar40 = vucomiss_avx512f(auVar29);
                    auVar240 = ZEXT1664(auVar40);
                    if (bVar11) {
                      vmovshdup_avx(auVar29);
                      auVar40 = vucomiss_avx512f(auVar39);
                      if (bVar11) {
                        auVar38 = vucomiss_avx512f(auVar40);
                        auVar240 = ZEXT1664(auVar38);
                        if (bVar11) {
                          auVar37 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2])
                                                  ,ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]
                                                          ),0x1c);
                          auVar42 = vinsertps_avx(auVar37,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                          aVar1 = (ray->super_RayK<1>).org.field_0;
                          auVar37 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                          auVar37 = vdpps_avx(auVar37,auVar42,0x7f);
                          auVar36 = vsubps_avx(local_248,(undefined1  [16])aVar1);
                          auVar36 = vdpps_avx(auVar36,auVar42,0x7f);
                          auVar33 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                          auVar33 = vdpps_avx(auVar33,auVar42,0x7f);
                          auVar41 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                          auVar41 = vdpps_avx(auVar41,auVar42,0x7f);
                          auVar32 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                          auVar32 = vdpps_avx(auVar32,auVar42,0x7f);
                          auVar34 = vsubps_avx(_local_268,(undefined1  [16])aVar1);
                          auVar34 = vdpps_avx(auVar34,auVar42,0x7f);
                          auVar35 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                          auVar35 = vdpps_avx(auVar35,auVar42,0x7f);
                          auVar43 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                          auVar42 = vdpps_avx(auVar43,auVar42,0x7f);
                          auVar43 = vsubss_avx512f(auVar38,auVar40);
                          fVar201 = auVar40._0_4_;
                          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * fVar201)),auVar43
                                                    ,auVar37);
                          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * fVar201)),auVar43
                                                    ,auVar36);
                          auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * fVar201)),auVar43
                                                    ,auVar33);
                          auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar42._0_4_)),auVar43
                                                    ,auVar41);
                          auVar38 = vsubss_avx512f(auVar38,auVar29);
                          auVar151._0_4_ = auVar38._0_4_;
                          fVar201 = auVar151._0_4_ * auVar151._0_4_ * auVar151._0_4_;
                          fVar197 = auVar29._0_4_;
                          fVar185 = fVar197 * 3.0 * auVar151._0_4_ * auVar151._0_4_;
                          fVar196 = auVar151._0_4_ * fVar197 * fVar197 * 3.0;
                          fVar199 = fVar197 * fVar197 * fVar197;
                          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * auVar33._0_4_)),
                                                    ZEXT416((uint)fVar196),auVar36);
                          auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar185),auVar37);
                          auVar40 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar201),auVar40);
                          fVar198 = auVar40._0_4_;
                          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar198) &&
                             (fVar200 = (ray->super_RayK<1>).tfar, fVar198 <= fVar200)) {
                            auVar40 = vshufps_avx(auVar29,auVar29,0x55);
                            auVar37 = vsubps_avx512vl(auVar30,auVar40);
                            fVar84 = auVar40._0_4_;
                            auVar183._0_4_ = fVar84 * (float)local_218._0_4_;
                            fVar109 = auVar40._4_4_;
                            auVar183._4_4_ = fVar109 * (float)local_218._4_4_;
                            fVar121 = auVar40._8_4_;
                            auVar183._8_4_ = fVar121 * fStack_210;
                            fVar122 = auVar40._12_4_;
                            auVar183._12_4_ = fVar122 * fStack_20c;
                            auVar195._0_4_ = fVar84 * (float)local_268._0_4_;
                            auVar195._4_4_ = fVar109 * (float)local_268._4_4_;
                            auVar195._8_4_ = fVar121 * fStack_260;
                            auVar195._12_4_ = fVar122 * fStack_25c;
                            auVar209._0_4_ = fVar84 * (float)local_278._0_4_;
                            auVar209._4_4_ = fVar109 * (float)local_278._4_4_;
                            auVar209._8_4_ = fVar121 * fStack_270;
                            auVar209._12_4_ = fVar122 * fStack_26c;
                            auVar164._0_4_ = fVar84 * (float)local_238._0_4_;
                            auVar164._4_4_ = fVar109 * (float)local_238._4_4_;
                            auVar164._8_4_ = fVar121 * fStack_230;
                            auVar164._12_4_ = fVar122 * fStack_22c;
                            auVar30 = vfmadd231ps_fma(auVar183,auVar37,local_208);
                            auVar40 = vfmadd231ps_fma(auVar195,auVar37,local_248);
                            auVar38 = vfmadd231ps_fma(auVar209,auVar37,local_258);
                            auVar37 = vfmadd231ps_fma(auVar164,auVar37,local_228);
                            auVar30 = vsubps_avx(auVar40,auVar30);
                            auVar40 = vsubps_avx(auVar38,auVar40);
                            auVar38 = vsubps_avx(auVar37,auVar38);
                            auVar210._0_4_ = fVar197 * auVar40._0_4_;
                            auVar210._4_4_ = fVar197 * auVar40._4_4_;
                            auVar210._8_4_ = fVar197 * auVar40._8_4_;
                            auVar210._12_4_ = fVar197 * auVar40._12_4_;
                            auVar151._4_4_ = auVar151._0_4_;
                            auVar151._8_4_ = auVar151._0_4_;
                            auVar151._12_4_ = auVar151._0_4_;
                            auVar30 = vfmadd231ps_fma(auVar210,auVar151,auVar30);
                            auVar165._0_4_ = fVar197 * auVar38._0_4_;
                            auVar165._4_4_ = fVar197 * auVar38._4_4_;
                            auVar165._8_4_ = fVar197 * auVar38._8_4_;
                            auVar165._12_4_ = fVar197 * auVar38._12_4_;
                            auVar40 = vfmadd231ps_fma(auVar165,auVar151,auVar40);
                            auVar166._0_4_ = fVar197 * auVar40._0_4_;
                            auVar166._4_4_ = fVar197 * auVar40._4_4_;
                            auVar166._8_4_ = fVar197 * auVar40._8_4_;
                            auVar166._12_4_ = fVar197 * auVar40._12_4_;
                            auVar30 = vfmadd231ps_fma(auVar166,auVar151,auVar30);
                            auVar15._8_4_ = 0x40400000;
                            auVar15._0_8_ = 0x4040000040400000;
                            auVar15._12_4_ = 0x40400000;
                            auVar30 = vmulps_avx512vl(auVar30,auVar15);
                            pGVar6 = (context->scene->geometries).items[uVar25].ptr;
                            if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                              auVar145._0_4_ = fVar199 * (float)local_108._0_4_;
                              auVar145._4_4_ = fVar199 * (float)local_108._4_4_;
                              auVar145._8_4_ = fVar199 * fStack_100;
                              auVar145._12_4_ = fVar199 * fStack_fc;
                              auVar132._4_4_ = fVar196;
                              auVar132._0_4_ = fVar196;
                              auVar132._8_4_ = fVar196;
                              auVar132._12_4_ = fVar196;
                              auVar40 = vfmadd132ps_fma(auVar132,auVar145,local_f8);
                              auVar117._4_4_ = fVar185;
                              auVar117._0_4_ = fVar185;
                              auVar117._8_4_ = fVar185;
                              auVar117._12_4_ = fVar185;
                              auVar40 = vfmadd132ps_fma(auVar117,auVar40,local_e8);
                              auVar107._4_4_ = fVar201;
                              auVar107._0_4_ = fVar201;
                              auVar107._8_4_ = fVar201;
                              auVar107._12_4_ = fVar201;
                              auVar37 = vfmadd132ps_fma(auVar107,auVar40,local_d8);
                              auVar40 = vshufps_avx(auVar37,auVar37,0xc9);
                              auVar38 = vshufps_avx(auVar30,auVar30,0xc9);
                              auVar108._0_4_ = auVar37._0_4_ * auVar38._0_4_;
                              auVar108._4_4_ = auVar37._4_4_ * auVar38._4_4_;
                              auVar108._8_4_ = auVar37._8_4_ * auVar38._8_4_;
                              auVar108._12_4_ = auVar37._12_4_ * auVar38._12_4_;
                              auVar30 = vfmsub231ps_fma(auVar108,auVar30,auVar40);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                (ray->super_RayK<1>).tfar = fVar198;
                                auVar40 = vshufps_avx(auVar30,auVar30,0xe9);
                                uVar12 = vmovlps_avx(auVar40);
                                *(undefined8 *)&(ray->Ng).field_0 = uVar12;
                                (ray->Ng).field_0.field_0.z = auVar30._0_4_;
                                uVar12 = vmovlps_avx(auVar29);
                                ray->u = (float)(int)uVar12;
                                ray->v = (float)(int)((ulong)uVar12 >> 0x20);
                                ray->primID = (uint)local_310;
                                ray->geomID = uVar25;
                                ray->instID[0] = context->user->instID[0];
                                ray->instPrimID[0] = context->user->instPrimID[0];
                              }
                              else {
                                auVar40 = vshufps_avx(auVar30,auVar30,0xe9);
                                local_148 = vmovlps_avx(auVar40);
                                local_140 = auVar30._0_4_;
                                local_13c = vmovlps_avx(auVar29);
                                local_134 = (uint)local_310;
                                local_130 = uVar25;
                                local_12c = context->user->instID[0];
                                local_128 = context->user->instPrimID[0];
                                (ray->super_RayK<1>).tfar = fVar198;
                                local_32c = -1;
                                local_2a8.valid = &local_32c;
                                local_2a8.geometryUserPtr = pGVar6->userPtr;
                                local_2a8.context = context->user;
                                local_2a8.ray = (RTCRayN *)ray;
                                local_2a8.hit = (RTCHitN *)&local_148;
                                local_2a8.N = 1;
                                if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b02a94:
                                  auVar29 = auVar238._0_16_;
                                  p_Var7 = context->args->filter;
                                  if (p_Var7 != (RTCFilterFunctionN)0x0) {
                                    if (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                       (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                      (*p_Var7)(&local_2a8);
                                      auVar237 = ZEXT1664(local_2e8);
                                      auVar245 = ZEXT1664(local_308);
                                      auVar244 = ZEXT1664(local_2f8);
                                      auVar243 = ZEXT1664(local_328);
                                      auVar29 = vxorps_avx512vl(auVar29,auVar29);
                                      auVar238 = ZEXT1664(auVar29);
                                      auVar240 = ZEXT464(0x3f800000);
                                      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      in_ZMM18 = ZEXT3264(auVar62);
                                      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar246 = ZEXT1664(auVar29);
                                      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar242 = ZEXT1664(auVar29);
                                      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar241 = ZEXT1664(auVar29);
                                    }
                                    if (*local_2a8.valid == 0) goto LAB_01b02be5;
                                  }
                                  (((Vec3f *)((long)local_2a8.ray + 0x30))->field_0).components[0] =
                                       *(float *)local_2a8.hit;
                                  (((Vec3f *)((long)local_2a8.ray + 0x30))->field_0).field_0.y =
                                       *(float *)(local_2a8.hit + 4);
                                  (((Vec3f *)((long)local_2a8.ray + 0x30))->field_0).field_0.z =
                                       *(float *)(local_2a8.hit + 8);
                                  *(float *)((long)local_2a8.ray + 0x3c) =
                                       *(float *)(local_2a8.hit + 0xc);
                                  *(float *)((long)local_2a8.ray + 0x40) =
                                       *(float *)(local_2a8.hit + 0x10);
                                  *(float *)((long)local_2a8.ray + 0x44) =
                                       *(float *)(local_2a8.hit + 0x14);
                                  *(float *)((long)local_2a8.ray + 0x48) =
                                       *(float *)(local_2a8.hit + 0x18);
                                  *(float *)((long)local_2a8.ray + 0x4c) =
                                       *(float *)(local_2a8.hit + 0x1c);
                                  *(float *)((long)local_2a8.ray + 0x50) =
                                       *(float *)(local_2a8.hit + 0x20);
                                }
                                else {
                                  (*pGVar6->intersectionFilterN)(&local_2a8);
                                  auVar237 = ZEXT1664(local_2e8);
                                  auVar245 = ZEXT1664(local_308);
                                  auVar244 = ZEXT1664(local_2f8);
                                  auVar243 = ZEXT1664(local_328);
                                  auVar29 = vxorps_avx512vl(auVar39,auVar39);
                                  auVar238 = ZEXT1664(auVar29);
                                  auVar240 = ZEXT464(0x3f800000);
                                  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM18 = ZEXT3264(auVar62);
                                  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar246 = ZEXT1664(auVar29);
                                  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar242 = ZEXT1664(auVar29);
                                  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar241 = ZEXT1664(auVar29);
                                  if (*local_2a8.valid != 0) goto LAB_01b02a94;
LAB_01b02be5:
                                  (ray->super_RayK<1>).tfar = fVar200;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
            }
          }
          else {
            auVar29 = vxorps_avx512vl(auVar32,auVar32);
            auVar238 = ZEXT1664(auVar29);
            auVar243 = ZEXT1664(local_328);
          }
        }
      }
    } while (bVar10);
    auVar29 = vinsertps_avx(local_2d8,auVar31,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }